

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBTensorOp.cpp
# Opt level: O0

void __thiscall
amrex::MLEBTensorOp::apply
          (MLEBTensorOp *this,int amrlev,int mglev,MultiFab *out,MultiFab *in,BCMode bc_mode,
          StateMode s_mode,MLMGBndry *bndry)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  Long LVar6;
  pointer pFVar7;
  MFItInfo *this_00;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  int in_EDX;
  int iVar11;
  long in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  MFIter *extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  undefined4 in_stack_00000008;
  MultiCutFab *in_stack_00000010;
  Box tbx_1;
  iterator __end4_1;
  iterator __begin4_1;
  range_impl<amrex::Box> *__range4_1;
  Array4<const_double> *velbfab;
  bool is_eb_inhomog;
  bool is_eb_dirichlet;
  Array4<const_double> foo;
  Array4<const_double> *bc;
  Array4<const_double> *fcz;
  Array4<const_double> *fcy;
  Array4<const_double> *fcx;
  Array4<const_double> *apz;
  Array4<const_double> *apy;
  Array4<const_double> *apx;
  Array4<const_double> *vol;
  Array4<const_amrex::EBCellFlag> *flag;
  Array4<const_int> *ccm;
  Array4<const_double> *kapb;
  Array4<const_double> *etab;
  Array4<const_double> *vfab;
  Box tbx;
  iterator __end4;
  iterator __begin4;
  range_impl<amrex::Box> *__range4;
  Array4<const_double> fzfab;
  Array4<const_double> fyfab;
  Array4<const_double> fxfab;
  Array4<double> axfab;
  FabType fabtyp;
  Box *bx;
  MFIter mfi;
  MFItInfo mfi_info;
  Real bscalar;
  MultiFab *kapebmf;
  MultiFab *etaebmf;
  iMultiFab *mask;
  Array<MultiFab,_3> *fluxmf;
  GpuArray<double,_3U> dxinv;
  Geometry *geom;
  MultiCutFab *bcent;
  Array<const_MultiCutFab_*,_3> fcent;
  Array<const_MultiCutFab_*,_3> area;
  MultiFab *vfrac;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *factory;
  int i;
  int j;
  int k;
  Dim3 hi;
  Dim3 lo;
  Real dzi;
  Real dyi;
  Real dxi;
  Real volinv;
  Real tauyz;
  Real tauxz;
  Real tauzz;
  Real tauzy;
  Real tauxy;
  Real tauyy;
  Real tauzx;
  Real tauyx;
  Real tauxx;
  Real tautmp;
  Real mu;
  Real xi;
  Real divu;
  Real dwdz;
  Real dwdy;
  Real dwdx;
  Real dvdz;
  Real dvdy;
  Real dvdx;
  Real dudz;
  Real dudy;
  Real dudx;
  Real dwdn;
  Real dvdn;
  Real dudn;
  Real velg;
  Real oneggg;
  Real gxyz;
  Real gyz;
  Real gxz;
  Real gxy;
  int kk_4;
  int jj_4;
  int ii_4;
  int isz;
  int isy;
  int isx;
  Real gz;
  Real gy;
  Real gx;
  Real dginv;
  Real dg;
  Real dx_eb;
  Real velb_2;
  Real velb_1;
  Real velb_0;
  Real anrmz;
  Real anrmy;
  Real anrmx;
  Real anorminv;
  Real dapz;
  Real dapy;
  Real dapx;
  Real feb_2;
  Real feb_1;
  Real feb_0;
  Real kappa;
  Real fracy_3;
  Real fracx_3;
  int jj_3;
  int ii_3;
  Real fzp_2;
  Real fzp_1;
  Real fzp_0;
  Real fracy_2;
  Real fracx_2;
  int jj_2;
  int ii_2;
  Real fzm_2;
  Real fzm_1;
  Real fzm_0;
  Real fracz_3;
  Real fracx_1;
  int kk_3;
  int ii_1;
  Real fyp_2;
  Real fyp_1;
  Real fyp_0;
  Real fracz_2;
  Real fracx;
  int kk_2;
  int ii;
  Real fym_2;
  Real fym_1;
  Real fym_0;
  Real fracz_1;
  Real fracy_1;
  int kk_1;
  int jj_1;
  Real fxp_2;
  Real fxp_1;
  Real fxp_0;
  Real fracz;
  Real fracy;
  int kk;
  int jj;
  Real fxm_2;
  Real fxm_1;
  Real fxm_0;
  int i_1;
  int j_1;
  int k_1;
  Dim3 hi_1;
  Dim3 lo_1;
  Real dzi_1;
  Real dyi_1;
  Real dxi_1;
  MLMGBndry *in_stack_00018cc0;
  undefined8 in_stack_ffffffffffffd9d8;
  size_type i_00;
  MultiCutFab *mfi_00;
  MultiCutFab *this_01;
  FabArray<amrex::EBCellFlagFab> *in_stack_ffffffffffffd9e8;
  MFItInfo *in_stack_ffffffffffffd9f0;
  MultiFab *in_stack_ffffffffffffd9f8;
  MFItInfo *in_stack_ffffffffffffda00;
  FabArrayBase *in_stack_ffffffffffffda08;
  MLEBABecLap *in_stack_ffffffffffffda10;
  double dVar12;
  StateMode in_stack_ffffffffffffda20;
  MLMGBndry *in_stack_ffffffffffffda28;
  MFIter *local_25c8;
  MFIter *in_stack_ffffffffffffda40;
  double local_25b8;
  double local_25a8;
  double local_2598;
  double local_2588;
  double local_2578;
  double local_2568;
  double local_2558;
  double local_2548;
  double local_2538;
  double local_2528;
  Box *in_stack_ffffffffffffdb00;
  undefined4 in_stack_ffffffffffffdb08;
  FabType in_stack_ffffffffffffdb0c;
  MultiCutFab *local_24f0;
  MultiFab *local_24e8;
  FabArray<amrex::EBCellFlagFab> *local_24e0;
  long local_24d8;
  Box local_24b4;
  iterator local_2498;
  iterator local_2480;
  undefined1 local_2468 [40];
  undefined1 *local_2440;
  long local_2438 [8];
  long *local_23f8;
  byte local_23ea;
  byte local_23e9;
  Array4<const_double> local_23e8;
  long local_23a8 [8];
  long *local_2368;
  long local_2360 [8];
  long *local_2320;
  long local_2318 [8];
  long *local_22d8;
  long local_22d0 [8];
  long *local_2290;
  long local_2288 [8];
  long *local_2248;
  long local_2240 [8];
  long *local_2200;
  long local_21f8 [8];
  long *local_21b8;
  long local_21b0 [8];
  long *local_2170;
  long local_2168 [8];
  long *local_2128;
  long local_2120 [8];
  long *local_20e0;
  long local_20d8 [8];
  long *local_2098;
  long local_2090 [8];
  long *local_2050;
  long local_2048 [8];
  long *local_2008;
  Box local_1ffc;
  iterator local_1fe0;
  iterator local_1fc8;
  undefined1 local_1fb0 [40];
  undefined1 *local_1f88;
  long local_1f80;
  long local_1f78;
  long local_1f70;
  long local_1f68;
  int local_1f60;
  int local_1f5c;
  int local_1f58;
  long local_1f40;
  long local_1f38;
  long local_1f30;
  long local_1f28;
  int local_1f20;
  int local_1f1c;
  int local_1f18;
  long local_1f00;
  long local_1ef8;
  long local_1ef0;
  long local_1ee8;
  int local_1ee0;
  int local_1edc;
  int local_1ed8;
  long local_1ec0;
  long local_1eb8;
  long local_1eb0;
  long local_1ea8;
  int local_1ea0;
  int local_1e9c;
  int local_1e98;
  FabType local_1e80;
  undefined1 local_1e7c [28];
  undefined1 *local_1e60;
  MFIter local_1e58;
  MFItInfo local_1df4;
  double local_1de0;
  MultiFab *local_1dd8;
  type local_1dd0;
  iMultiFab *local_1dc8;
  array<amrex::MultiFab,_3UL> *local_1dc0;
  GpuArray<double,_3U> local_1db8;
  Geometry *local_1da0;
  MultiCutFab *local_1d98;
  undefined8 local_1d90;
  undefined8 local_1d88;
  undefined8 local_1d80;
  undefined8 local_1d78;
  undefined8 local_1d70;
  undefined8 local_1d68;
  MultiFab *local_1d60;
  FabArray<amrex::EBCellFlagFab> *local_1d58;
  long local_1d50;
  int local_1d30;
  int local_1d1c;
  int local_1d18;
  int local_1d14;
  undefined8 local_1d10;
  int local_1d08;
  undefined8 local_1cfc;
  int local_1cf4;
  undefined8 local_1cf0;
  int local_1ce8;
  undefined8 local_1ce0;
  int local_1cd8;
  double local_1cd0;
  double local_1cc8;
  double local_1cc0;
  double local_1cb8;
  GpuArray<double,_3U> *local_1cb0;
  long *local_1ca8;
  long *local_1ca0;
  long *local_1c98;
  long *local_1c90;
  Box *local_1c88;
  double local_1c80;
  double local_1c78;
  double local_1c70;
  double local_1c68;
  double local_1c60;
  double local_1c58;
  double local_1c50;
  double local_1c48;
  double local_1c40;
  double local_1c38;
  double local_1c30;
  double local_1c28;
  double local_1c20;
  double local_1c18;
  double local_1c10;
  double local_1c08;
  double local_1c00;
  double local_1bf8;
  double local_1bf0;
  double local_1be8;
  double local_1be0;
  double local_1bd8;
  double local_1bd0;
  double local_1bc8;
  double local_1bc0;
  double local_1bb8;
  double local_1bb0;
  double local_1ba8;
  double local_1ba0;
  double local_1b98;
  double local_1b90;
  double local_1b88;
  int local_1b80;
  int local_1b7c;
  int local_1b78;
  int local_1b74;
  int local_1b70;
  int local_1b6c;
  double local_1b68;
  double local_1b60;
  double local_1b58;
  double local_1b50;
  double local_1b48;
  double local_1b40;
  double local_1b38;
  double local_1b30;
  double local_1b28;
  double local_1b20;
  double local_1b18;
  double local_1b10;
  double local_1b08;
  double local_1b00;
  double local_1af8;
  double local_1af0;
  double local_1ae8;
  double local_1ae0;
  double local_1ad8;
  double local_1ad0;
  double local_1ac8;
  double local_1ac0;
  double local_1ab8;
  double local_1ab0;
  double local_1aa8;
  double local_1aa0;
  MFIter *local_1a98;
  int local_1a90;
  int local_1a8c;
  double local_1a88;
  double local_1a80;
  double local_1a78;
  double local_1a70;
  double local_1a68;
  int local_1a60;
  int local_1a5c;
  double local_1a58;
  double local_1a50;
  double local_1a48;
  double local_1a40;
  double local_1a38;
  int local_1a30;
  int local_1a2c;
  double local_1a28;
  double local_1a20;
  double local_1a18;
  double local_1a10;
  double local_1a08;
  int local_1a00;
  int local_19fc;
  double local_19f8;
  double local_19f0;
  double local_19e8;
  double local_19e0;
  double local_19d8;
  int local_19d0;
  int local_19cc;
  double local_19c8;
  double local_19c0;
  double local_19b8;
  double local_19b0;
  double local_19a8;
  int local_19a0;
  int local_199c;
  double local_1998;
  double local_1990;
  double local_1988;
  int local_197c;
  int local_1978;
  int local_1974;
  undefined8 local_195c;
  int local_1954;
  int local_1940;
  int iStack_193c;
  double local_1930;
  double local_1928;
  double local_1920;
  double local_1918;
  GpuArray<double,_3U> *local_1910;
  byte local_1902;
  byte local_1901;
  long *local_1900;
  long *local_18f8;
  long *local_18f0;
  long *local_18e8;
  long *local_18e0;
  long *local_18d8;
  long *local_18d0;
  long *local_18c8;
  long *local_18c0;
  long *local_18b8;
  long *local_18b0;
  MultiFab *in_stack_ffffffffffffe758;
  long *plVar13;
  undefined8 in_stack_ffffffffffffe760;
  long *plVar14;
  MLEBTensorOp *in_stack_ffffffffffffe768;
  long *plVar15;
  undefined8 in_stack_ffffffffffffed10;
  undefined4 in_stack_ffffffffffffed18;
  undefined4 in_stack_ffffffffffffed1c;
  int in_stack_ffffffffffffed20;
  int in_stack_ffffffffffffed24;
  MLEBTensorOp *in_stack_ffffffffffffed28;
  
  i_00 = CONCAT44((int)((ulong)in_stack_ffffffffffffd9d8 >> 0x20),in_stack_00000008);
  this_01 = in_stack_00000010;
  local_1d30 = in_EDX;
  MLEBABecLap::apply(in_stack_ffffffffffffda10,(int)((ulong)in_stack_ffffffffffffda08 >> 0x20),
                     (int)in_stack_ffffffffffffda08,(MultiFab *)in_stack_ffffffffffffda00,
                     in_stack_ffffffffffffd9f8,(BCMode)((ulong)in_stack_ffffffffffffd9f0 >> 0x20),
                     in_stack_ffffffffffffda20,in_stack_ffffffffffffda28);
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)this_01,i_00);
  LVar6 = Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
          ::size((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                  *)0x1580fa6);
  if (local_1d30 < LVar6) {
    applyBCTensor(in_stack_ffffffffffffed28,in_stack_ffffffffffffed24,in_stack_ffffffffffffed20,
                  (MultiFab *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),
                  (BCMode)((ulong)in_stack_ffffffffffffed10 >> 0x20),
                  (StateMode)in_stack_ffffffffffffed10,in_stack_00018cc0);
    Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                  *)this_01,(size_type)in_stack_00000010);
    Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                  *)this_01,(size_type)in_stack_00000010);
    pFVar7 = std::
             unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ::get((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                    *)this_01);
    if (pFVar7 == (pointer)0x0) {
      local_24d8 = 0;
      mfi_00 = in_stack_00000010;
    }
    else {
      local_24d8 = __dynamic_cast(pFVar7,&FabFactory<amrex::FArrayBox>::typeinfo,
                                  &EBFArrayBoxFactory::typeinfo,0);
      mfi_00 = in_stack_00000010;
    }
    local_1d50 = local_24d8;
    if (local_24d8 == 0) {
      local_24e0 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    }
    else {
      local_24e0 = EBFArrayBoxFactory::getMultiEBCellFlagFab((EBFArrayBoxFactory *)this_01);
    }
    local_1d58 = local_24e0;
    if (local_1d50 == 0) {
      local_24e8 = (MultiFab *)0x0;
    }
    else {
      local_24e8 = EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)this_01);
    }
    local_1d60 = local_24e8;
    if (local_1d50 == 0) {
      memset(&local_1d78,0,0x18);
      local_1d78 = 0;
      local_1d70 = 0;
      local_1d68 = 0;
    }
    else {
      EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)this_01);
    }
    if (local_1d50 == 0) {
      memset(&local_1d90,0,0x18);
      local_1d90 = 0;
      local_1d88 = 0;
      local_1d80 = 0;
    }
    else {
      EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)this_01);
    }
    if (local_1d50 == 0) {
      local_24f0 = (MultiCutFab *)0x0;
    }
    else {
      local_24f0 = EBFArrayBoxFactory::getBndryCent((EBFArrayBoxFactory *)this_01);
    }
    local_1d98 = local_24f0;
    Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  *)this_01,(size_type)mfi_00);
    local_1da0 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                           ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)this_01,
                            (size_type)mfi_00);
    CoordSys::InvCellSizeArray(&local_1db8,&local_1da0->super_CoordSys);
    Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                  *)this_01,(size_type)mfi_00);
    local_1dc0 = Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                 ::operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                               *)this_01,(size_type)mfi_00);
    Vector<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                  *)this_01,(size_type)mfi_00);
    local_1dc8 = Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>::operator[]
                           ((Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_> *)this_01,
                            (size_type)mfi_00);
    Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                  *)this_01,(size_type)mfi_00);
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  *)this_01,(size_type)mfi_00);
    local_1dd0 = std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                           ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                            this_01);
    Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                  *)this_01,(size_type)mfi_00);
    local_1dd8 = Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                           ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)this_01,
                            (size_type)mfi_00);
    local_1de0 = *(double *)(in_RDI + 0x338);
    compCrossTerms(in_stack_ffffffffffffe768,(int)((ulong)in_stack_ffffffffffffe760 >> 0x20),
                   (int)in_stack_ffffffffffffe760,in_stack_ffffffffffffe758);
    MFItInfo::MFItInfo(in_stack_ffffffffffffd9f0);
    this_00 = MFItInfo::EnableTiling(&local_1df4,(IntVect *)&FabArrayBase::mfiter_tile_size);
    MFItInfo::SetDynamic(this_00,true);
    MFIter::MFIter((MFIter *)in_stack_ffffffffffffda10,in_stack_ffffffffffffda08,
                   in_stack_ffffffffffffda00);
    while (bVar5 = MFIter::isValid(&local_1e58), bVar5) {
      MFIter::tilebox(in_stack_ffffffffffffda40);
      local_1e60 = local_1e7c;
      if (local_1d58 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
        in_stack_ffffffffffffdb0c = regular;
      }
      else {
        FabArray<amrex::EBCellFlagFab>::operator[]
                  ((FabArray<amrex::EBCellFlagFab> *)this_01,(MFIter *)mfi_00);
        in_stack_ffffffffffffdb0c =
             EBCellFlagFab::getType
                       ((EBCellFlagFab *)
                        CONCAT44(in_stack_ffffffffffffdb0c,in_stack_ffffffffffffdb08),
                        in_stack_ffffffffffffdb00);
      }
      local_1e80 = in_stack_ffffffffffffdb0c;
      if (in_stack_ffffffffffffdb0c != covered) {
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd9e8,(MFIter *)this_01);
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)this_01,(size_type)mfi_00);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd9e8,(MFIter *)this_01);
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)this_01,(size_type)mfi_00);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd9e8,(MFIter *)this_01);
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)this_01,(size_type)mfi_00);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd9e8,(MFIter *)this_01);
        if (local_1e80 == regular) {
          Gpu::Range<amrex::Box>((Box *)this_01);
          local_1f88 = local_1fb0;
          Gpu::range_detail::range_impl<amrex::Box>::begin((range_impl<amrex::Box> *)this_01);
          Gpu::range_detail::range_impl<amrex::Box>::end((range_impl<amrex::Box> *)this_01);
          while (bVar5 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                   (&local_1fc8,&local_1fe0), bVar5) {
            in_stack_ffffffffffffdb00 = &local_1ffc;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                      (in_stack_ffffffffffffdb00,&local_1fc8);
            local_1c90 = &local_1ec0;
            local_1c98 = &local_1f00;
            local_1ca0 = &local_1f40;
            local_1ca8 = &local_1f80;
            local_1cb0 = &local_1db8;
            local_1cb8 = local_1de0;
            local_1cc0 = local_1de0 * local_1db8.arr[0];
            local_1cc8 = local_1de0 * local_1db8.arr[1];
            local_1cd0 = local_1de0 * local_1db8.arr[2];
            iVar11 = (in_stack_ffffffffffffdb00->smallend).vect[0];
            iVar1 = (in_stack_ffffffffffffdb00->smallend).vect[1];
            local_1cf0 = *(undefined8 *)(in_stack_ffffffffffffdb00->smallend).vect;
            iVar2 = (in_stack_ffffffffffffdb00->bigend).vect[0];
            iVar3 = (in_stack_ffffffffffffdb00->bigend).vect[1];
            local_1d10 = *(undefined8 *)(in_stack_ffffffffffffdb00->bigend).vect;
            local_1d08 = (in_stack_ffffffffffffdb00->bigend).vect[2];
            local_1ce8 = (in_stack_ffffffffffffdb00->smallend).vect[2];
            for (local_1d14 = local_1ce8; iVar4 = iVar1, local_1d14 <= local_1d08;
                local_1d14 = local_1d14 + 1) {
              while (local_1d18 = iVar4, iVar4 = iVar11, local_1d18 <= iVar3) {
                while (local_1d1c = iVar4, local_1d1c <= iVar2) {
                  lVar10 = (long)(local_1d1c - local_1ea0) + (local_1d18 - local_1e9c) * local_1eb8
                           + (local_1d14 - local_1e98) * local_1eb0;
                  *(double *)(local_1ec0 + lVar10 * 8) =
                       local_1cd0 *
                       (*(double *)
                         (local_1f80 +
                         ((long)(local_1d1c - local_1f60) + (local_1d18 - local_1f5c) * local_1f78 +
                         ((local_1d14 + 1) - local_1f58) * local_1f70) * 8) -
                       *(double *)
                        (local_1f80 +
                        ((long)(local_1d1c - local_1f60) + (local_1d18 - local_1f5c) * local_1f78 +
                        (local_1d14 - local_1f58) * local_1f70) * 8)) +
                       local_1cc0 *
                       (*(double *)
                         (local_1f00 +
                         ((long)((local_1d1c + 1) - local_1ee0) +
                          (local_1d18 - local_1edc) * local_1ef8 +
                         (local_1d14 - local_1ed8) * local_1ef0) * 8) -
                       *(double *)
                        (local_1f00 +
                        ((long)(local_1d1c - local_1ee0) + (local_1d18 - local_1edc) * local_1ef8 +
                        (local_1d14 - local_1ed8) * local_1ef0) * 8)) +
                       local_1cc8 *
                       (*(double *)
                         (local_1f40 +
                         ((long)(local_1d1c - local_1f20) +
                          ((local_1d18 + 1) - local_1f1c) * local_1f38 +
                         (local_1d14 - local_1f18) * local_1f30) * 8) -
                       *(double *)
                        (local_1f40 +
                        ((long)(local_1d1c - local_1f20) + (local_1d18 - local_1f1c) * local_1f38 +
                        (local_1d14 - local_1f18) * local_1f30) * 8)) +
                       *(double *)(local_1ec0 + lVar10 * 8);
                  lVar10 = (long)(local_1d1c - local_1ea0) + (local_1d18 - local_1e9c) * local_1eb8
                           + (local_1d14 - local_1e98) * local_1eb0 + local_1ea8;
                  *(double *)(local_1ec0 + lVar10 * 8) =
                       local_1cd0 *
                       (*(double *)
                         (local_1f80 +
                         ((long)(local_1d1c - local_1f60) + (local_1d18 - local_1f5c) * local_1f78 +
                          ((local_1d14 + 1) - local_1f58) * local_1f70 + local_1f68) * 8) -
                       *(double *)
                        (local_1f80 +
                        ((long)(local_1d1c - local_1f60) + (local_1d18 - local_1f5c) * local_1f78 +
                         (local_1d14 - local_1f58) * local_1f70 + local_1f68) * 8)) +
                       local_1cc0 *
                       (*(double *)
                         (local_1f00 +
                         ((long)((local_1d1c + 1) - local_1ee0) +
                          (local_1d18 - local_1edc) * local_1ef8 +
                          (local_1d14 - local_1ed8) * local_1ef0 + local_1ee8) * 8) -
                       *(double *)
                        (local_1f00 +
                        ((long)(local_1d1c - local_1ee0) + (local_1d18 - local_1edc) * local_1ef8 +
                         (local_1d14 - local_1ed8) * local_1ef0 + local_1ee8) * 8)) +
                       local_1cc8 *
                       (*(double *)
                         (local_1f40 +
                         ((long)(local_1d1c - local_1f20) +
                          ((local_1d18 + 1) - local_1f1c) * local_1f38 +
                          (local_1d14 - local_1f18) * local_1f30 + local_1f28) * 8) -
                       *(double *)
                        (local_1f40 +
                        ((long)(local_1d1c - local_1f20) + (local_1d18 - local_1f1c) * local_1f38 +
                         (local_1d14 - local_1f18) * local_1f30 + local_1f28) * 8)) +
                       *(double *)(local_1ec0 + lVar10 * 8);
                  lVar10 = (long)(local_1d1c - local_1ea0) + (local_1d18 - local_1e9c) * local_1eb8
                           + (local_1d14 - local_1e98) * local_1eb0 + local_1ea8 * 2;
                  *(double *)(local_1ec0 + lVar10 * 8) =
                       local_1cd0 *
                       (*(double *)
                         (local_1f80 +
                         ((long)(local_1d1c - local_1f60) + (local_1d18 - local_1f5c) * local_1f78 +
                          ((local_1d14 + 1) - local_1f58) * local_1f70 + local_1f68 * 2) * 8) -
                       *(double *)
                        (local_1f80 +
                        ((long)(local_1d1c - local_1f60) + (local_1d18 - local_1f5c) * local_1f78 +
                         (local_1d14 - local_1f58) * local_1f70 + local_1f68 * 2) * 8)) +
                       local_1cc0 *
                       (*(double *)
                         (local_1f00 +
                         ((long)((local_1d1c + 1) - local_1ee0) +
                          (local_1d18 - local_1edc) * local_1ef8 +
                          (local_1d14 - local_1ed8) * local_1ef0 + local_1ee8 * 2) * 8) -
                       *(double *)
                        (local_1f00 +
                        ((long)(local_1d1c - local_1ee0) + (local_1d18 - local_1edc) * local_1ef8 +
                         (local_1d14 - local_1ed8) * local_1ef0 + local_1ee8 * 2) * 8)) +
                       local_1cc8 *
                       (*(double *)
                         (local_1f40 +
                         ((long)(local_1d1c - local_1f20) +
                          ((local_1d18 + 1) - local_1f1c) * local_1f38 +
                          (local_1d14 - local_1f18) * local_1f30 + local_1f28 * 2) * 8) -
                       *(double *)
                        (local_1f40 +
                        ((long)(local_1d1c - local_1f20) + (local_1d18 - local_1f1c) * local_1f38 +
                         (local_1d14 - local_1f18) * local_1f30 + local_1f28 * 2) * 8)) +
                       *(double *)(local_1ec0 + lVar10 * 8);
                  iVar4 = local_1d1c + 1;
                }
                iVar4 = local_1d18 + 1;
              }
            }
            local_1cfc = local_1d10;
            local_1cf4 = local_1d08;
            local_1ce0 = local_1cf0;
            local_1cd8 = local_1ce8;
            local_1c88 = in_stack_ffffffffffffdb00;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_1fc8);
          }
        }
        else {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd9e8,(MFIter *)this_01);
          local_2008 = local_2048;
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd9e8,(MFIter *)this_01);
          local_2050 = local_2090;
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd9e8,(MFIter *)this_01);
          local_2098 = local_20d8;
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((FabArray<amrex::IArrayBox> *)in_stack_ffffffffffffd9e8,(MFIter *)this_01);
          local_20e0 = local_2120;
          FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                    (in_stack_ffffffffffffd9e8,(MFIter *)this_01);
          local_2128 = local_2168;
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd9e8,(MFIter *)this_01);
          local_2170 = local_21b0;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)this_01,(size_type)mfi_00);
          MultiCutFab::const_array(this_01,(MFIter *)mfi_00);
          local_21b8 = local_21f8;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)this_01,(size_type)mfi_00);
          MultiCutFab::const_array(this_01,(MFIter *)mfi_00);
          local_2200 = local_2240;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)this_01,(size_type)mfi_00);
          MultiCutFab::const_array(this_01,(MFIter *)mfi_00);
          local_2248 = local_2288;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)this_01,(size_type)mfi_00);
          MultiCutFab::const_array(this_01,(MFIter *)mfi_00);
          local_2290 = local_22d0;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)this_01,(size_type)mfi_00);
          MultiCutFab::const_array(this_01,(MFIter *)mfi_00);
          local_22d8 = local_2318;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)this_01,(size_type)mfi_00);
          MultiCutFab::const_array(this_01,(MFIter *)mfi_00);
          local_2320 = local_2360;
          MultiCutFab::const_array(this_01,(MFIter *)mfi_00);
          local_2368 = local_23a8;
          Array4<const_double>::Array4(&local_23e8);
          local_23e9 = MLEBABecLap::isEBDirichlet((MLEBABecLap *)0x15829d1);
          local_23ea = *(int *)(in_RDI + 0x3d0) != 0;
          if (((bool)local_23e9) && ((bool)local_23ea)) {
            Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
            ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                          *)this_01,(size_type)mfi_00);
            std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                      ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                       0x1582a30);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd9e8,(MFIter *)this_01);
          }
          else {
            memcpy(local_2438,&local_23e8,0x3c);
          }
          local_23f8 = local_2438;
          Gpu::Range<amrex::Box>((Box *)this_01);
          local_2440 = local_2468;
          Gpu::range_detail::range_impl<amrex::Box>::begin((range_impl<amrex::Box> *)this_01);
          Gpu::range_detail::range_impl<amrex::Box>::end((range_impl<amrex::Box> *)this_01);
          while (bVar5 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                   (&local_2480,&local_2498), bVar5) {
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_24b4,&local_2480);
            local_18b0 = local_2098;
            local_18b8 = local_20e0;
            local_18c0 = local_2128;
            local_18c8 = local_2170;
            local_18d0 = local_21b8;
            local_18d8 = local_2200;
            local_18e0 = local_2248;
            local_18e8 = local_2290;
            local_18f0 = local_22d8;
            local_18f8 = local_2320;
            local_1900 = local_2368;
            local_1901 = local_23e9 & 1;
            local_1902 = local_23ea & 1;
            local_1910 = &local_1db8;
            local_1918 = local_1de0;
            local_1920 = local_1db8.arr[0];
            local_1928 = local_1db8.arr[1];
            local_1930 = local_1db8.arr[2];
            local_1940 = local_24b4.smallend.vect[0];
            iStack_193c = local_24b4.smallend.vect[1];
            local_195c = CONCAT44(local_24b4.bigend.vect[1],local_24b4.bigend.vect[0]);
            local_1954 = local_24b4.bigend.vect[2];
            plVar13 = local_2050;
            plVar14 = local_23f8;
            plVar15 = local_2008;
            for (local_1974 = local_24b4.smallend.vect[2]; local_1974 <= local_1954;
                local_1974 = local_1974 + 1) {
              for (local_1978 = iStack_193c; local_1978 <= local_195c._4_4_;
                  local_1978 = local_1978 + 1) {
                for (local_197c = local_1940; local_197c <= (int)local_195c;
                    local_197c = local_197c + 1) {
                  if ((*(uint *)(*local_18c0 +
                                ((long)(local_197c - (int)local_18c0[4]) +
                                 (long)(local_1978 - *(int *)((long)local_18c0 + 0x24)) *
                                 local_18c0[1] +
                                (long)(local_1974 - (int)local_18c0[5]) * local_18c0[2]) * 4) & 3)
                      == 0) {
                    lVar10 = (long)(local_197c - local_1ea0) +
                             (local_1978 - local_1e9c) * local_1eb8 +
                             (local_1974 - local_1e98) * local_1eb0;
                    *(double *)(local_1ec0 + lVar10 * 8) =
                         local_1918 *
                         (local_1930 *
                          (*(double *)
                            (local_1f80 +
                            ((long)(local_197c - local_1f60) +
                             (local_1978 - local_1f5c) * local_1f78 +
                            ((local_1974 + 1) - local_1f58) * local_1f70) * 8) -
                          *(double *)
                           (local_1f80 +
                           ((long)(local_197c - local_1f60) + (local_1978 - local_1f5c) * local_1f78
                           + (local_1974 - local_1f58) * local_1f70) * 8)) +
                         local_1920 *
                         (*(double *)
                           (local_1f00 +
                           ((long)((local_197c + 1) - local_1ee0) +
                            (local_1978 - local_1edc) * local_1ef8 +
                           (local_1974 - local_1ed8) * local_1ef0) * 8) -
                         *(double *)
                          (local_1f00 +
                          ((long)(local_197c - local_1ee0) + (local_1978 - local_1edc) * local_1ef8
                          + (local_1974 - local_1ed8) * local_1ef0) * 8)) +
                         local_1928 *
                         (*(double *)
                           (local_1f40 +
                           ((long)(local_197c - local_1f20) +
                            ((local_1978 + 1) - local_1f1c) * local_1f38 +
                           (local_1974 - local_1f18) * local_1f30) * 8) -
                         *(double *)
                          (local_1f40 +
                          ((long)(local_197c - local_1f20) + (local_1978 - local_1f1c) * local_1f38
                          + (local_1974 - local_1f18) * local_1f30) * 8))) +
                         *(double *)(local_1ec0 + lVar10 * 8);
                    lVar10 = (long)(local_197c - local_1ea0) +
                             (local_1978 - local_1e9c) * local_1eb8 +
                             (local_1974 - local_1e98) * local_1eb0 + local_1ea8;
                    *(double *)(local_1ec0 + lVar10 * 8) =
                         local_1918 *
                         (local_1930 *
                          (*(double *)
                            (local_1f80 +
                            ((long)(local_197c - local_1f60) +
                             (local_1978 - local_1f5c) * local_1f78 +
                             ((local_1974 + 1) - local_1f58) * local_1f70 + local_1f68) * 8) -
                          *(double *)
                           (local_1f80 +
                           ((long)(local_197c - local_1f60) + (local_1978 - local_1f5c) * local_1f78
                            + (local_1974 - local_1f58) * local_1f70 + local_1f68) * 8)) +
                         local_1920 *
                         (*(double *)
                           (local_1f00 +
                           ((long)((local_197c + 1) - local_1ee0) +
                            (local_1978 - local_1edc) * local_1ef8 +
                            (local_1974 - local_1ed8) * local_1ef0 + local_1ee8) * 8) -
                         *(double *)
                          (local_1f00 +
                          ((long)(local_197c - local_1ee0) + (local_1978 - local_1edc) * local_1ef8
                           + (local_1974 - local_1ed8) * local_1ef0 + local_1ee8) * 8)) +
                         local_1928 *
                         (*(double *)
                           (local_1f40 +
                           ((long)(local_197c - local_1f20) +
                            ((local_1978 + 1) - local_1f1c) * local_1f38 +
                            (local_1974 - local_1f18) * local_1f30 + local_1f28) * 8) -
                         *(double *)
                          (local_1f40 +
                          ((long)(local_197c - local_1f20) + (local_1978 - local_1f1c) * local_1f38
                           + (local_1974 - local_1f18) * local_1f30 + local_1f28) * 8))) +
                         *(double *)(local_1ec0 + lVar10 * 8);
                    lVar10 = (long)(local_197c - local_1ea0) +
                             (local_1978 - local_1e9c) * local_1eb8 +
                             (local_1974 - local_1e98) * local_1eb0 + local_1ea8 * 2;
                    *(double *)(local_1ec0 + lVar10 * 8) =
                         local_1918 *
                         (local_1930 *
                          (*(double *)
                            (local_1f80 +
                            ((long)(local_197c - local_1f60) +
                             (local_1978 - local_1f5c) * local_1f78 +
                             ((local_1974 + 1) - local_1f58) * local_1f70 + local_1f68 * 2) * 8) -
                          *(double *)
                           (local_1f80 +
                           ((long)(local_197c - local_1f60) + (local_1978 - local_1f5c) * local_1f78
                            + (local_1974 - local_1f58) * local_1f70 + local_1f68 * 2) * 8)) +
                         local_1920 *
                         (*(double *)
                           (local_1f00 +
                           ((long)((local_197c + 1) - local_1ee0) +
                            (local_1978 - local_1edc) * local_1ef8 +
                            (local_1974 - local_1ed8) * local_1ef0 + local_1ee8 * 2) * 8) -
                         *(double *)
                          (local_1f00 +
                          ((long)(local_197c - local_1ee0) + (local_1978 - local_1edc) * local_1ef8
                           + (local_1974 - local_1ed8) * local_1ef0 + local_1ee8 * 2) * 8)) +
                         local_1928 *
                         (*(double *)
                           (local_1f40 +
                           ((long)(local_197c - local_1f20) +
                            ((local_1978 + 1) - local_1f1c) * local_1f38 +
                            (local_1974 - local_1f18) * local_1f30 + local_1f28 * 2) * 8) -
                         *(double *)
                          (local_1f40 +
                          ((long)(local_197c - local_1f20) + (local_1978 - local_1f1c) * local_1f38
                           + (local_1974 - local_1f18) * local_1f30 + local_1f28 * 2) * 8))) +
                         *(double *)(local_1ec0 + lVar10 * 8);
                  }
                  else if ((*(uint *)(*local_18c0 +
                                     ((long)(local_197c - (int)local_18c0[4]) +
                                      (long)(local_1978 - *(int *)((long)local_18c0 + 0x24)) *
                                      local_18c0[1] +
                                     (long)(local_1974 - (int)local_18c0[5]) * local_18c0[2]) * 4) &
                           3) == 1) {
                    local_1988 = *(double *)
                                  (local_1f00 +
                                  ((long)(local_197c - local_1ee0) +
                                   (local_1978 - local_1edc) * local_1ef8 +
                                  (local_1974 - local_1ed8) * local_1ef0) * 8);
                    local_1990 = *(double *)
                                  (local_1f00 +
                                  ((long)(local_197c - local_1ee0) +
                                   (local_1978 - local_1edc) * local_1ef8 +
                                   (local_1974 - local_1ed8) * local_1ef0 + local_1ee8) * 8);
                    local_1998 = *(double *)
                                  (local_1f00 +
                                  ((long)(local_197c - local_1ee0) +
                                   (local_1978 - local_1edc) * local_1ef8 +
                                   (local_1974 - local_1ed8) * local_1ef0 + local_1ee8 * 2) * 8);
                    if ((0.0 < *(double *)
                                (*local_18d0 +
                                ((long)(local_197c - (int)local_18d0[4]) +
                                 (long)(local_1978 - *(int *)((long)local_18d0 + 0x24)) *
                                 local_18d0[1] +
                                (long)(local_1974 - (int)local_18d0[5]) * local_18d0[2]) * 8)) &&
                       (pdVar9 = (double *)
                                 (*local_18d0 +
                                 ((long)(local_197c - (int)local_18d0[4]) +
                                  (long)(local_1978 - *(int *)((long)local_18d0 + 0x24)) *
                                  local_18d0[1] +
                                 (long)(local_1974 - (int)local_18d0[5]) * local_18d0[2]) * 8),
                       *pdVar9 <= 1.0 && *pdVar9 != 1.0)) {
                      local_199c = -1;
                      if (0.0 <= *(double *)
                                  (*local_18e8 +
                                  ((long)(local_197c - (int)local_18e8[4]) +
                                   (long)(local_1978 - *(int *)((long)local_18e8 + 0x24)) *
                                   local_18e8[1] +
                                  (long)(local_1974 - (int)local_18e8[5]) * local_18e8[2]) * 8)) {
                        local_199c = 1;
                      }
                      local_199c = local_1978 + local_199c;
                      local_19a0 = -1;
                      if (0.0 <= *(double *)
                                  (*local_18e8 +
                                  ((long)(local_197c - (int)local_18e8[4]) +
                                   (long)(local_1978 - *(int *)((long)local_18e8 + 0x24)) *
                                   local_18e8[1] +
                                   (long)(local_1974 - (int)local_18e8[5]) * local_18e8[2] +
                                  local_18e8[3]) * 8)) {
                        local_19a0 = 1;
                      }
                      local_19a0 = local_1974 + local_19a0;
                      if ((*(int *)(*local_18b8 +
                                   ((long)((local_197c + -1) - (int)local_18b8[4]) +
                                    (long)(local_199c - *(int *)((long)local_18b8 + 0x24)) *
                                    local_18b8[1] +
                                   (long)(local_1974 - (int)local_18b8[5]) * local_18b8[2]) * 4) ==
                           0) && (*(int *)(*local_18b8 +
                                          ((long)(local_197c - (int)local_18b8[4]) +
                                           (long)(local_199c - *(int *)((long)local_18b8 + 0x24)) *
                                           local_18b8[1] +
                                          (long)(local_1974 - (int)local_18b8[5]) * local_18b8[2]) *
                                          4) == 0)) {
                        local_2528 = 0.0;
                      }
                      else {
                        std::abs((int)local_18e8[2]);
                        local_2528 = extraout_XMM0_Qa;
                      }
                      local_19a8 = local_2528;
                      if ((*(int *)(*local_18b8 +
                                   ((long)((local_197c + -1) - (int)local_18b8[4]) +
                                    (long)(local_1978 - *(int *)((long)local_18b8 + 0x24)) *
                                    local_18b8[1] +
                                   (long)(local_19a0 - (int)local_18b8[5]) * local_18b8[2]) * 4) ==
                           0) && (*(int *)(*local_18b8 +
                                          ((long)(local_197c - (int)local_18b8[4]) +
                                           (long)(local_1978 - *(int *)((long)local_18b8 + 0x24)) *
                                           local_18b8[1] +
                                          (long)(local_19a0 - (int)local_18b8[5]) * local_18b8[2]) *
                                          4) == 0)) {
                        local_2538 = 0.0;
                      }
                      else {
                        std::abs((int)local_18e8[2]);
                        local_2538 = extraout_XMM0_Qa_00;
                      }
                      local_19b0 = local_2538;
                      local_1988 = local_19a8 * local_2538 *
                                   *(double *)
                                    (local_1f00 +
                                    ((long)(local_197c - local_1ee0) +
                                     (local_199c - local_1edc) * local_1ef8 +
                                    (local_19a0 - local_1ed8) * local_1ef0) * 8) +
                                   local_2538 * (1.0 - local_19a8) *
                                   *(double *)
                                    (local_1f00 +
                                    ((long)(local_197c - local_1ee0) +
                                     (local_1978 - local_1edc) * local_1ef8 +
                                    (local_19a0 - local_1ed8) * local_1ef0) * 8) +
                                   (1.0 - local_19a8) * (1.0 - local_2538) * local_1988 +
                                   local_19a8 * (1.0 - local_2538) *
                                   *(double *)
                                    (local_1f00 +
                                    ((long)(local_197c - local_1ee0) +
                                     (local_199c - local_1edc) * local_1ef8 +
                                    (local_1974 - local_1ed8) * local_1ef0) * 8);
                      local_1990 = local_19a8 * local_2538 *
                                   *(double *)
                                    (local_1f00 +
                                    ((long)(local_197c - local_1ee0) +
                                     (local_199c - local_1edc) * local_1ef8 +
                                     (local_19a0 - local_1ed8) * local_1ef0 + local_1ee8) * 8) +
                                   local_2538 * (1.0 - local_19a8) *
                                   *(double *)
                                    (local_1f00 +
                                    ((long)(local_197c - local_1ee0) +
                                     (local_1978 - local_1edc) * local_1ef8 +
                                     (local_19a0 - local_1ed8) * local_1ef0 + local_1ee8) * 8) +
                                   (1.0 - local_19a8) * (1.0 - local_2538) * local_1990 +
                                   local_19a8 * (1.0 - local_2538) *
                                   *(double *)
                                    (local_1f00 +
                                    ((long)(local_197c - local_1ee0) +
                                     (local_199c - local_1edc) * local_1ef8 +
                                     (local_1974 - local_1ed8) * local_1ef0 + local_1ee8) * 8);
                      local_1998 = local_19a8 * local_2538 *
                                   *(double *)
                                    (local_1f00 +
                                    ((long)(local_197c - local_1ee0) +
                                     (local_199c - local_1edc) * local_1ef8 +
                                     (local_19a0 - local_1ed8) * local_1ef0 + local_1ee8 * 2) * 8) +
                                   local_2538 * (1.0 - local_19a8) *
                                   *(double *)
                                    (local_1f00 +
                                    ((long)(local_197c - local_1ee0) +
                                     (local_1978 - local_1edc) * local_1ef8 +
                                     (local_19a0 - local_1ed8) * local_1ef0 + local_1ee8 * 2) * 8) +
                                   (1.0 - local_19a8) * (1.0 - local_2538) * local_1998 +
                                   local_19a8 * (1.0 - local_2538) *
                                   *(double *)
                                    (local_1f00 +
                                    ((long)(local_197c - local_1ee0) +
                                     (local_199c - local_1edc) * local_1ef8 +
                                     (local_1974 - local_1ed8) * local_1ef0 + local_1ee8 * 2) * 8);
                    }
                    local_19b8 = *(double *)
                                  (local_1f00 +
                                  ((long)((local_197c + 1) - local_1ee0) +
                                   (local_1978 - local_1edc) * local_1ef8 +
                                  (local_1974 - local_1ed8) * local_1ef0) * 8);
                    local_19c0 = *(double *)
                                  (local_1f00 +
                                  ((long)((local_197c + 1) - local_1ee0) +
                                   (local_1978 - local_1edc) * local_1ef8 +
                                   (local_1974 - local_1ed8) * local_1ef0 + local_1ee8) * 8);
                    local_19c8 = *(double *)
                                  (local_1f00 +
                                  ((long)((local_197c + 1) - local_1ee0) +
                                   (local_1978 - local_1edc) * local_1ef8 +
                                   (local_1974 - local_1ed8) * local_1ef0 + local_1ee8 * 2) * 8);
                    if ((0.0 < *(double *)
                                (*local_18d0 +
                                ((long)((local_197c + 1) - (int)local_18d0[4]) +
                                 (long)(local_1978 - *(int *)((long)local_18d0 + 0x24)) *
                                 local_18d0[1] +
                                (long)(local_1974 - (int)local_18d0[5]) * local_18d0[2]) * 8)) &&
                       (pdVar9 = (double *)
                                 (*local_18d0 +
                                 ((long)((local_197c + 1) - (int)local_18d0[4]) +
                                  (long)(local_1978 - *(int *)((long)local_18d0 + 0x24)) *
                                  local_18d0[1] +
                                 (long)(local_1974 - (int)local_18d0[5]) * local_18d0[2]) * 8),
                       *pdVar9 <= 1.0 && *pdVar9 != 1.0)) {
                      local_19cc = -1;
                      if (0.0 <= *(double *)
                                  (*local_18e8 +
                                  ((long)((local_197c + 1) - (int)local_18e8[4]) +
                                   (long)(local_1978 - *(int *)((long)local_18e8 + 0x24)) *
                                   local_18e8[1] +
                                  (long)(local_1974 - (int)local_18e8[5]) * local_18e8[2]) * 8)) {
                        local_19cc = 1;
                      }
                      local_19cc = local_1978 + local_19cc;
                      local_19d0 = -1;
                      if (0.0 <= *(double *)
                                  (*local_18e8 +
                                  ((long)((local_197c + 1) - (int)local_18e8[4]) +
                                   (long)(local_1978 - *(int *)((long)local_18e8 + 0x24)) *
                                   local_18e8[1] +
                                   (long)(local_1974 - (int)local_18e8[5]) * local_18e8[2] +
                                  local_18e8[3]) * 8)) {
                        local_19d0 = 1;
                      }
                      local_19d0 = local_1974 + local_19d0;
                      if ((*(int *)(*local_18b8 +
                                   ((long)(local_197c - (int)local_18b8[4]) +
                                    (long)(local_19cc - *(int *)((long)local_18b8 + 0x24)) *
                                    local_18b8[1] +
                                   (long)(local_1974 - (int)local_18b8[5]) * local_18b8[2]) * 4) ==
                           0) && (*(int *)(*local_18b8 +
                                          ((long)((local_197c + 1) - (int)local_18b8[4]) +
                                           (long)(local_19cc - *(int *)((long)local_18b8 + 0x24)) *
                                           local_18b8[1] +
                                          (long)(local_1974 - (int)local_18b8[5]) * local_18b8[2]) *
                                          4) == 0)) {
                        local_2548 = 0.0;
                      }
                      else {
                        std::abs((int)local_18e8[2]);
                        local_2548 = extraout_XMM0_Qa_01;
                      }
                      local_19d8 = local_2548;
                      if ((*(int *)(*local_18b8 +
                                   ((long)(local_197c - (int)local_18b8[4]) +
                                    (long)(local_1978 - *(int *)((long)local_18b8 + 0x24)) *
                                    local_18b8[1] +
                                   (long)(local_19d0 - (int)local_18b8[5]) * local_18b8[2]) * 4) ==
                           0) && (*(int *)(*local_18b8 +
                                          ((long)((local_197c + 1) - (int)local_18b8[4]) +
                                           (long)(local_1978 - *(int *)((long)local_18b8 + 0x24)) *
                                           local_18b8[1] +
                                          (long)(local_19d0 - (int)local_18b8[5]) * local_18b8[2]) *
                                          4) == 0)) {
                        local_2558 = 0.0;
                      }
                      else {
                        std::abs((int)local_18e8[2]);
                        local_2558 = extraout_XMM0_Qa_02;
                      }
                      local_19e0 = local_2558;
                      local_19b8 = local_19d8 * local_2558 *
                                   *(double *)
                                    (local_1f00 +
                                    ((long)((local_197c + 1) - local_1ee0) +
                                     (local_19cc - local_1edc) * local_1ef8 +
                                    (local_19d0 - local_1ed8) * local_1ef0) * 8) +
                                   local_2558 * (1.0 - local_19d8) *
                                   *(double *)
                                    (local_1f00 +
                                    ((long)((local_197c + 1) - local_1ee0) +
                                     (local_1978 - local_1edc) * local_1ef8 +
                                    (local_19d0 - local_1ed8) * local_1ef0) * 8) +
                                   (1.0 - local_19d8) * (1.0 - local_2558) * local_19b8 +
                                   local_19d8 * (1.0 - local_2558) *
                                   *(double *)
                                    (local_1f00 +
                                    ((long)((local_197c + 1) - local_1ee0) +
                                     (local_19cc - local_1edc) * local_1ef8 +
                                    (local_1974 - local_1ed8) * local_1ef0) * 8);
                      local_19c0 = local_19d8 * local_2558 *
                                   *(double *)
                                    (local_1f00 +
                                    ((long)((local_197c + 1) - local_1ee0) +
                                     (local_19cc - local_1edc) * local_1ef8 +
                                     (local_19d0 - local_1ed8) * local_1ef0 + local_1ee8) * 8) +
                                   local_2558 * (1.0 - local_19d8) *
                                   *(double *)
                                    (local_1f00 +
                                    ((long)((local_197c + 1) - local_1ee0) +
                                     (local_1978 - local_1edc) * local_1ef8 +
                                     (local_19d0 - local_1ed8) * local_1ef0 + local_1ee8) * 8) +
                                   (1.0 - local_19d8) * (1.0 - local_2558) * local_19c0 +
                                   local_19d8 * (1.0 - local_2558) *
                                   *(double *)
                                    (local_1f00 +
                                    ((long)((local_197c + 1) - local_1ee0) +
                                     (local_19cc - local_1edc) * local_1ef8 +
                                     (local_1974 - local_1ed8) * local_1ef0 + local_1ee8) * 8);
                      local_19c8 = local_19d8 * local_2558 *
                                   *(double *)
                                    (local_1f00 +
                                    ((long)((local_197c + 1) - local_1ee0) +
                                     (local_19cc - local_1edc) * local_1ef8 +
                                     (local_19d0 - local_1ed8) * local_1ef0 + local_1ee8 * 2) * 8) +
                                   local_2558 * (1.0 - local_19d8) *
                                   *(double *)
                                    (local_1f00 +
                                    ((long)((local_197c + 1) - local_1ee0) +
                                     (local_1978 - local_1edc) * local_1ef8 +
                                     (local_19d0 - local_1ed8) * local_1ef0 + local_1ee8 * 2) * 8) +
                                   (1.0 - local_19d8) * (1.0 - local_2558) * local_19c8 +
                                   local_19d8 * (1.0 - local_2558) *
                                   *(double *)
                                    (local_1f00 +
                                    ((long)((local_197c + 1) - local_1ee0) +
                                     (local_19cc - local_1edc) * local_1ef8 +
                                     (local_1974 - local_1ed8) * local_1ef0 + local_1ee8 * 2) * 8);
                    }
                    local_19e8 = *(double *)
                                  (local_1f40 +
                                  ((long)(local_197c - local_1f20) +
                                   (local_1978 - local_1f1c) * local_1f38 +
                                  (local_1974 - local_1f18) * local_1f30) * 8);
                    local_19f0 = *(double *)
                                  (local_1f40 +
                                  ((long)(local_197c - local_1f20) +
                                   (local_1978 - local_1f1c) * local_1f38 +
                                   (local_1974 - local_1f18) * local_1f30 + local_1f28) * 8);
                    local_19f8 = *(double *)
                                  (local_1f40 +
                                  ((long)(local_197c - local_1f20) +
                                   (local_1978 - local_1f1c) * local_1f38 +
                                   (local_1974 - local_1f18) * local_1f30 + local_1f28 * 2) * 8);
                    if ((0.0 < *(double *)
                                (*local_18d8 +
                                ((long)(local_197c - (int)local_18d8[4]) +
                                 (long)(local_1978 - *(int *)((long)local_18d8 + 0x24)) *
                                 local_18d8[1] +
                                (long)(local_1974 - (int)local_18d8[5]) * local_18d8[2]) * 8)) &&
                       (pdVar9 = (double *)
                                 (*local_18d8 +
                                 ((long)(local_197c - (int)local_18d8[4]) +
                                  (long)(local_1978 - *(int *)((long)local_18d8 + 0x24)) *
                                  local_18d8[1] +
                                 (long)(local_1974 - (int)local_18d8[5]) * local_18d8[2]) * 8),
                       *pdVar9 <= 1.0 && *pdVar9 != 1.0)) {
                      local_19fc = -1;
                      if (0.0 <= *(double *)
                                  (*local_18f0 +
                                  ((long)(local_197c - (int)local_18f0[4]) +
                                   (long)(local_1978 - *(int *)((long)local_18f0 + 0x24)) *
                                   local_18f0[1] +
                                  (long)(local_1974 - (int)local_18f0[5]) * local_18f0[2]) * 8)) {
                        local_19fc = 1;
                      }
                      local_19fc = local_197c + local_19fc;
                      local_1a00 = -1;
                      if (0.0 <= *(double *)
                                  (*local_18f0 +
                                  ((long)(local_197c - (int)local_18f0[4]) +
                                   (long)(local_1978 - *(int *)((long)local_18f0 + 0x24)) *
                                   local_18f0[1] +
                                   (long)(local_1974 - (int)local_18f0[5]) * local_18f0[2] +
                                  local_18f0[3]) * 8)) {
                        local_1a00 = 1;
                      }
                      local_1a00 = local_1974 + local_1a00;
                      if ((*(int *)(*local_18b8 +
                                   ((long)(local_19fc - (int)local_18b8[4]) +
                                    (long)((local_1978 + -1) - *(int *)((long)local_18b8 + 0x24)) *
                                    local_18b8[1] +
                                   (long)(local_1974 - (int)local_18b8[5]) * local_18b8[2]) * 4) ==
                           0) && (*(int *)(*local_18b8 +
                                          ((long)(local_19fc - (int)local_18b8[4]) +
                                           (long)(local_1978 - *(int *)((long)local_18b8 + 0x24)) *
                                           local_18b8[1] +
                                          (long)(local_1974 - (int)local_18b8[5]) * local_18b8[2]) *
                                          4) == 0)) {
                        local_2568 = 0.0;
                      }
                      else {
                        std::abs((int)local_18f0[2]);
                        local_2568 = extraout_XMM0_Qa_03;
                      }
                      local_1a08 = local_2568;
                      if ((*(int *)(*local_18b8 +
                                   ((long)(local_197c - (int)local_18b8[4]) +
                                    (long)((local_1978 + -1) - *(int *)((long)local_18b8 + 0x24)) *
                                    local_18b8[1] +
                                   (long)(local_1a00 - (int)local_18b8[5]) * local_18b8[2]) * 4) ==
                           0) && (*(int *)(*local_18b8 +
                                          ((long)(local_197c - (int)local_18b8[4]) +
                                           (long)(local_1978 - *(int *)((long)local_18b8 + 0x24)) *
                                           local_18b8[1] +
                                          (long)(local_1a00 - (int)local_18b8[5]) * local_18b8[2]) *
                                          4) == 0)) {
                        local_2578 = 0.0;
                      }
                      else {
                        std::abs((int)local_18f0[2]);
                        local_2578 = extraout_XMM0_Qa_04;
                      }
                      local_1a10 = local_2578;
                      local_19e8 = local_1a08 * local_2578 *
                                   *(double *)
                                    (local_1f40 +
                                    ((long)(local_19fc - local_1f20) +
                                     (local_1978 - local_1f1c) * local_1f38 +
                                    (local_1a00 - local_1f18) * local_1f30) * 8) +
                                   local_2578 * (1.0 - local_1a08) *
                                   *(double *)
                                    (local_1f40 +
                                    ((long)(local_197c - local_1f20) +
                                     (local_1978 - local_1f1c) * local_1f38 +
                                    (local_1a00 - local_1f18) * local_1f30) * 8) +
                                   (1.0 - local_1a08) * (1.0 - local_2578) * local_19e8 +
                                   local_1a08 * (1.0 - local_2578) *
                                   *(double *)
                                    (local_1f40 +
                                    ((long)(local_19fc - local_1f20) +
                                     (local_1978 - local_1f1c) * local_1f38 +
                                    (local_1974 - local_1f18) * local_1f30) * 8);
                      local_19f0 = local_1a08 * local_2578 *
                                   *(double *)
                                    (local_1f40 +
                                    ((long)(local_19fc - local_1f20) +
                                     (local_1978 - local_1f1c) * local_1f38 +
                                     (local_1a00 - local_1f18) * local_1f30 + local_1f28) * 8) +
                                   local_2578 * (1.0 - local_1a08) *
                                   *(double *)
                                    (local_1f40 +
                                    ((long)(local_197c - local_1f20) +
                                     (local_1978 - local_1f1c) * local_1f38 +
                                     (local_1a00 - local_1f18) * local_1f30 + local_1f28) * 8) +
                                   (1.0 - local_1a08) * (1.0 - local_2578) * local_19f0 +
                                   local_1a08 * (1.0 - local_2578) *
                                   *(double *)
                                    (local_1f40 +
                                    ((long)(local_19fc - local_1f20) +
                                     (local_1978 - local_1f1c) * local_1f38 +
                                     (local_1974 - local_1f18) * local_1f30 + local_1f28) * 8);
                      local_19f8 = local_1a08 * local_2578 *
                                   *(double *)
                                    (local_1f40 +
                                    ((long)(local_19fc - local_1f20) +
                                     (local_1978 - local_1f1c) * local_1f38 +
                                     (local_1a00 - local_1f18) * local_1f30 + local_1f28 * 2) * 8) +
                                   local_2578 * (1.0 - local_1a08) *
                                   *(double *)
                                    (local_1f40 +
                                    ((long)(local_197c - local_1f20) +
                                     (local_1978 - local_1f1c) * local_1f38 +
                                     (local_1a00 - local_1f18) * local_1f30 + local_1f28 * 2) * 8) +
                                   (1.0 - local_1a08) * (1.0 - local_2578) * local_19f8 +
                                   local_1a08 * (1.0 - local_2578) *
                                   *(double *)
                                    (local_1f40 +
                                    ((long)(local_19fc - local_1f20) +
                                     (local_1978 - local_1f1c) * local_1f38 +
                                     (local_1974 - local_1f18) * local_1f30 + local_1f28 * 2) * 8);
                    }
                    local_1a18 = *(double *)
                                  (local_1f40 +
                                  ((long)(local_197c - local_1f20) +
                                   ((local_1978 + 1) - local_1f1c) * local_1f38 +
                                  (local_1974 - local_1f18) * local_1f30) * 8);
                    local_1a20 = *(double *)
                                  (local_1f40 +
                                  ((long)(local_197c - local_1f20) +
                                   ((local_1978 + 1) - local_1f1c) * local_1f38 +
                                   (local_1974 - local_1f18) * local_1f30 + local_1f28) * 8);
                    local_1a28 = *(double *)
                                  (local_1f40 +
                                  ((long)(local_197c - local_1f20) +
                                   ((local_1978 + 1) - local_1f1c) * local_1f38 +
                                   (local_1974 - local_1f18) * local_1f30 + local_1f28 * 2) * 8);
                    if ((0.0 < *(double *)
                                (*local_18d8 +
                                ((long)(local_197c - (int)local_18d8[4]) +
                                 (long)((local_1978 + 1) - *(int *)((long)local_18d8 + 0x24)) *
                                 local_18d8[1] +
                                (long)(local_1974 - (int)local_18d8[5]) * local_18d8[2]) * 8)) &&
                       (pdVar9 = (double *)
                                 (*local_18d8 +
                                 ((long)(local_197c - (int)local_18d8[4]) +
                                  (long)((local_1978 + 1) - *(int *)((long)local_18d8 + 0x24)) *
                                  local_18d8[1] +
                                 (long)(local_1974 - (int)local_18d8[5]) * local_18d8[2]) * 8),
                       *pdVar9 <= 1.0 && *pdVar9 != 1.0)) {
                      local_1a2c = -1;
                      if (0.0 <= *(double *)
                                  (*local_18f0 +
                                  ((long)(local_197c - (int)local_18f0[4]) +
                                   (long)((local_1978 + 1) - *(int *)((long)local_18f0 + 0x24)) *
                                   local_18f0[1] +
                                  (long)(local_1974 - (int)local_18f0[5]) * local_18f0[2]) * 8)) {
                        local_1a2c = 1;
                      }
                      local_1a2c = local_197c + local_1a2c;
                      local_1a30 = -1;
                      if (0.0 <= *(double *)
                                  (*local_18f0 +
                                  ((long)(local_197c - (int)local_18f0[4]) +
                                   (long)((local_1978 + 1) - *(int *)((long)local_18f0 + 0x24)) *
                                   local_18f0[1] +
                                   (long)(local_1974 - (int)local_18f0[5]) * local_18f0[2] +
                                  local_18f0[3]) * 8)) {
                        local_1a30 = 1;
                      }
                      local_1a30 = local_1974 + local_1a30;
                      if ((*(int *)(*local_18b8 +
                                   ((long)(local_1a2c - (int)local_18b8[4]) +
                                    (long)(local_1978 - *(int *)((long)local_18b8 + 0x24)) *
                                    local_18b8[1] +
                                   (long)(local_1974 - (int)local_18b8[5]) * local_18b8[2]) * 4) ==
                           0) && (*(int *)(*local_18b8 +
                                          ((long)(local_1a2c - (int)local_18b8[4]) +
                                           (long)((local_1978 + 1) -
                                                 *(int *)((long)local_18b8 + 0x24)) * local_18b8[1]
                                          + (long)(local_1974 - (int)local_18b8[5]) * local_18b8[2])
                                          * 4) == 0)) {
                        local_2588 = 0.0;
                      }
                      else {
                        std::abs((int)local_18f0[2]);
                        local_2588 = extraout_XMM0_Qa_05;
                      }
                      local_1a38 = local_2588;
                      if ((*(int *)(*local_18b8 +
                                   ((long)(local_197c - (int)local_18b8[4]) +
                                    (long)(local_1978 - *(int *)((long)local_18b8 + 0x24)) *
                                    local_18b8[1] +
                                   (long)(local_1a30 - (int)local_18b8[5]) * local_18b8[2]) * 4) ==
                           0) && (*(int *)(*local_18b8 +
                                          ((long)(local_197c - (int)local_18b8[4]) +
                                           (long)((local_1978 + 1) -
                                                 *(int *)((long)local_18b8 + 0x24)) * local_18b8[1]
                                          + (long)(local_1a30 - (int)local_18b8[5]) * local_18b8[2])
                                          * 4) == 0)) {
                        local_2598 = 0.0;
                      }
                      else {
                        std::abs((int)local_18f0[2]);
                        local_2598 = extraout_XMM0_Qa_06;
                      }
                      local_1a40 = local_2598;
                      local_1a18 = local_1a38 * local_2598 *
                                   *(double *)
                                    (local_1f40 +
                                    ((long)(local_1a2c - local_1f20) +
                                     ((local_1978 + 1) - local_1f1c) * local_1f38 +
                                    (local_1a30 - local_1f18) * local_1f30) * 8) +
                                   local_2598 * (1.0 - local_1a38) *
                                   *(double *)
                                    (local_1f40 +
                                    ((long)(local_197c - local_1f20) +
                                     ((local_1978 + 1) - local_1f1c) * local_1f38 +
                                    (local_1a30 - local_1f18) * local_1f30) * 8) +
                                   (1.0 - local_1a38) * (1.0 - local_2598) * local_1a18 +
                                   local_1a38 * (1.0 - local_2598) *
                                   *(double *)
                                    (local_1f40 +
                                    ((long)(local_1a2c - local_1f20) +
                                     ((local_1978 + 1) - local_1f1c) * local_1f38 +
                                    (local_1974 - local_1f18) * local_1f30) * 8);
                      local_1a20 = local_1a38 * local_2598 *
                                   *(double *)
                                    (local_1f40 +
                                    ((long)(local_1a2c - local_1f20) +
                                     ((local_1978 + 1) - local_1f1c) * local_1f38 +
                                     (local_1a30 - local_1f18) * local_1f30 + local_1f28) * 8) +
                                   local_2598 * (1.0 - local_1a38) *
                                   *(double *)
                                    (local_1f40 +
                                    ((long)(local_197c - local_1f20) +
                                     ((local_1978 + 1) - local_1f1c) * local_1f38 +
                                     (local_1a30 - local_1f18) * local_1f30 + local_1f28) * 8) +
                                   (1.0 - local_1a38) * (1.0 - local_2598) * local_1a20 +
                                   local_1a38 * (1.0 - local_2598) *
                                   *(double *)
                                    (local_1f40 +
                                    ((long)(local_1a2c - local_1f20) +
                                     ((local_1978 + 1) - local_1f1c) * local_1f38 +
                                     (local_1974 - local_1f18) * local_1f30 + local_1f28) * 8);
                      local_1a28 = local_1a38 * local_2598 *
                                   *(double *)
                                    (local_1f40 +
                                    ((long)(local_1a2c - local_1f20) +
                                     ((local_1978 + 1) - local_1f1c) * local_1f38 +
                                     (local_1a30 - local_1f18) * local_1f30 + local_1f28 * 2) * 8) +
                                   local_2598 * (1.0 - local_1a38) *
                                   *(double *)
                                    (local_1f40 +
                                    ((long)(local_197c - local_1f20) +
                                     ((local_1978 + 1) - local_1f1c) * local_1f38 +
                                     (local_1a30 - local_1f18) * local_1f30 + local_1f28 * 2) * 8) +
                                   (1.0 - local_1a38) * (1.0 - local_2598) * local_1a28 +
                                   local_1a38 * (1.0 - local_2598) *
                                   *(double *)
                                    (local_1f40 +
                                    ((long)(local_1a2c - local_1f20) +
                                     ((local_1978 + 1) - local_1f1c) * local_1f38 +
                                     (local_1974 - local_1f18) * local_1f30 + local_1f28 * 2) * 8);
                    }
                    local_1a48 = *(double *)
                                  (local_1f80 +
                                  ((long)(local_197c - local_1f60) +
                                   (local_1978 - local_1f5c) * local_1f78 +
                                  (local_1974 - local_1f58) * local_1f70) * 8);
                    local_1a50 = *(double *)
                                  (local_1f80 +
                                  ((long)(local_197c - local_1f60) +
                                   (local_1978 - local_1f5c) * local_1f78 +
                                   (local_1974 - local_1f58) * local_1f70 + local_1f68) * 8);
                    local_1a58 = *(double *)
                                  (local_1f80 +
                                  ((long)(local_197c - local_1f60) +
                                   (local_1978 - local_1f5c) * local_1f78 +
                                   (local_1974 - local_1f58) * local_1f70 + local_1f68 * 2) * 8);
                    if ((0.0 < *(double *)
                                (*local_18e0 +
                                ((long)(local_197c - (int)local_18e0[4]) +
                                 (long)(local_1978 - *(int *)((long)local_18e0 + 0x24)) *
                                 local_18e0[1] +
                                (long)(local_1974 - (int)local_18e0[5]) * local_18e0[2]) * 8)) &&
                       (pdVar9 = (double *)
                                 (*local_18e0 +
                                 ((long)(local_197c - (int)local_18e0[4]) +
                                  (long)(local_1978 - *(int *)((long)local_18e0 + 0x24)) *
                                  local_18e0[1] +
                                 (long)(local_1974 - (int)local_18e0[5]) * local_18e0[2]) * 8),
                       *pdVar9 <= 1.0 && *pdVar9 != 1.0)) {
                      local_1a5c = -1;
                      if (0.0 <= *(double *)
                                  (*local_18f8 +
                                  ((long)(local_197c - (int)local_18f8[4]) +
                                   (long)(local_1978 - *(int *)((long)local_18f8 + 0x24)) *
                                   local_18f8[1] +
                                  (long)(local_1974 - (int)local_18f8[5]) * local_18f8[2]) * 8)) {
                        local_1a5c = 1;
                      }
                      local_1a5c = local_197c + local_1a5c;
                      local_1a60 = -1;
                      if (0.0 <= *(double *)
                                  (*local_18f8 +
                                  ((long)(local_197c - (int)local_18f8[4]) +
                                   (long)(local_1978 - *(int *)((long)local_18f8 + 0x24)) *
                                   local_18f8[1] +
                                   (long)(local_1974 - (int)local_18f8[5]) * local_18f8[2] +
                                  local_18f8[3]) * 8)) {
                        local_1a60 = 1;
                      }
                      local_1a60 = local_1978 + local_1a60;
                      if ((*(int *)(*local_18b8 +
                                   ((long)(local_1a5c - (int)local_18b8[4]) +
                                    (long)(local_1978 - *(int *)((long)local_18b8 + 0x24)) *
                                    local_18b8[1] +
                                   (long)((local_1974 + -1) - (int)local_18b8[5]) * local_18b8[2]) *
                                   4) == 0) &&
                         (*(int *)(*local_18b8 +
                                  ((long)(local_1a5c - (int)local_18b8[4]) +
                                   (long)(local_1978 - *(int *)((long)local_18b8 + 0x24)) *
                                   local_18b8[1] +
                                  (long)(local_1974 - (int)local_18b8[5]) * local_18b8[2]) * 4) == 0
                         )) {
                        local_25a8 = 0.0;
                      }
                      else {
                        std::abs((int)local_18f8[2]);
                        local_25a8 = extraout_XMM0_Qa_07;
                      }
                      local_1a68 = local_25a8;
                      if ((*(int *)(*local_18b8 +
                                   ((long)(local_197c - (int)local_18b8[4]) +
                                    (long)(local_1a60 - *(int *)((long)local_18b8 + 0x24)) *
                                    local_18b8[1] +
                                   (long)((local_1974 + -1) - (int)local_18b8[5]) * local_18b8[2]) *
                                   4) == 0) &&
                         (*(int *)(*local_18b8 +
                                  ((long)(local_197c - (int)local_18b8[4]) +
                                   (long)(local_1a60 - *(int *)((long)local_18b8 + 0x24)) *
                                   local_18b8[1] +
                                  (long)(local_1974 - (int)local_18b8[5]) * local_18b8[2]) * 4) == 0
                         )) {
                        local_25b8 = 0.0;
                      }
                      else {
                        std::abs((int)local_18f8[2]);
                        local_25b8 = extraout_XMM0_Qa_08;
                      }
                      local_1a70 = local_25b8;
                      local_1a48 = local_1a68 * local_25b8 *
                                   *(double *)
                                    (local_1f80 +
                                    ((long)(local_1a5c - local_1f60) +
                                     (local_1a60 - local_1f5c) * local_1f78 +
                                    (local_1974 - local_1f58) * local_1f70) * 8) +
                                   local_25b8 * (1.0 - local_1a68) *
                                   *(double *)
                                    (local_1f80 +
                                    ((long)(local_197c - local_1f60) +
                                     (local_1a60 - local_1f5c) * local_1f78 +
                                    (local_1974 - local_1f58) * local_1f70) * 8) +
                                   (1.0 - local_1a68) * (1.0 - local_25b8) * local_1a48 +
                                   local_1a68 * (1.0 - local_25b8) *
                                   *(double *)
                                    (local_1f80 +
                                    ((long)(local_1a5c - local_1f60) +
                                     (local_1978 - local_1f5c) * local_1f78 +
                                    (local_1974 - local_1f58) * local_1f70) * 8);
                      local_1a50 = local_1a68 * local_25b8 *
                                   *(double *)
                                    (local_1f80 +
                                    ((long)(local_1a5c - local_1f60) +
                                     (local_1a60 - local_1f5c) * local_1f78 +
                                     (local_1974 - local_1f58) * local_1f70 + local_1f68) * 8) +
                                   local_25b8 * (1.0 - local_1a68) *
                                   *(double *)
                                    (local_1f80 +
                                    ((long)(local_197c - local_1f60) +
                                     (local_1a60 - local_1f5c) * local_1f78 +
                                     (local_1974 - local_1f58) * local_1f70 + local_1f68) * 8) +
                                   (1.0 - local_1a68) * (1.0 - local_25b8) * local_1a50 +
                                   local_1a68 * (1.0 - local_25b8) *
                                   *(double *)
                                    (local_1f80 +
                                    ((long)(local_1a5c - local_1f60) +
                                     (local_1978 - local_1f5c) * local_1f78 +
                                     (local_1974 - local_1f58) * local_1f70 + local_1f68) * 8);
                      local_1a58 = local_1a68 * local_25b8 *
                                   *(double *)
                                    (local_1f80 +
                                    ((long)(local_1a5c - local_1f60) +
                                     (local_1a60 - local_1f5c) * local_1f78 +
                                     (local_1974 - local_1f58) * local_1f70 + local_1f68 * 2) * 8) +
                                   local_25b8 * (1.0 - local_1a68) *
                                   *(double *)
                                    (local_1f80 +
                                    ((long)(local_197c - local_1f60) +
                                     (local_1a60 - local_1f5c) * local_1f78 +
                                     (local_1974 - local_1f58) * local_1f70 + local_1f68 * 2) * 8) +
                                   (1.0 - local_1a68) * (1.0 - local_25b8) * local_1a58 +
                                   local_1a68 * (1.0 - local_25b8) *
                                   *(double *)
                                    (local_1f80 +
                                    ((long)(local_1a5c - local_1f60) +
                                     (local_1978 - local_1f5c) * local_1f78 +
                                     (local_1974 - local_1f58) * local_1f70 + local_1f68 * 2) * 8);
                    }
                    local_1a78 = *(double *)
                                  (local_1f80 +
                                  ((long)(local_197c - local_1f60) +
                                   (local_1978 - local_1f5c) * local_1f78 +
                                  ((local_1974 + 1) - local_1f58) * local_1f70) * 8);
                    local_1a80 = *(double *)
                                  (local_1f80 +
                                  ((long)(local_197c - local_1f60) +
                                   (local_1978 - local_1f5c) * local_1f78 +
                                   ((local_1974 + 1) - local_1f58) * local_1f70 + local_1f68) * 8);
                    local_1a88 = *(double *)
                                  (local_1f80 +
                                  ((long)(local_197c - local_1f60) +
                                   (local_1978 - local_1f5c) * local_1f78 +
                                   ((local_1974 + 1) - local_1f58) * local_1f70 + local_1f68 * 2) *
                                  8);
                    if ((0.0 < *(double *)
                                (*local_18e0 +
                                ((long)(local_197c - (int)local_18e0[4]) +
                                 (long)(local_1978 - *(int *)((long)local_18e0 + 0x24)) *
                                 local_18e0[1] +
                                (long)((local_1974 + 1) - (int)local_18e0[5]) * local_18e0[2]) * 8))
                       && (pdVar9 = (double *)
                                    (*local_18e0 +
                                    ((long)(local_197c - (int)local_18e0[4]) +
                                     (long)(local_1978 - *(int *)((long)local_18e0 + 0x24)) *
                                     local_18e0[1] +
                                    (long)((local_1974 + 1) - (int)local_18e0[5]) * local_18e0[2]) *
                                    8), *pdVar9 <= 1.0 && *pdVar9 != 1.0)) {
                      local_1a8c = -1;
                      if (0.0 <= *(double *)
                                  (*local_18f8 +
                                  ((long)(local_197c - (int)local_18f8[4]) +
                                   (long)(local_1978 - *(int *)((long)local_18f8 + 0x24)) *
                                   local_18f8[1] +
                                  (long)((local_1974 + 1) - (int)local_18f8[5]) * local_18f8[2]) * 8
                                  )) {
                        local_1a8c = 1;
                      }
                      local_1a8c = local_197c + local_1a8c;
                      local_1a90 = -1;
                      if (0.0 <= *(double *)
                                  (*local_18f8 +
                                  ((long)(local_197c - (int)local_18f8[4]) +
                                   (long)(local_1978 - *(int *)((long)local_18f8 + 0x24)) *
                                   local_18f8[1] +
                                   (long)((local_1974 + 1) - (int)local_18f8[5]) * local_18f8[2] +
                                  local_18f8[3]) * 8)) {
                        local_1a90 = 1;
                      }
                      local_1a90 = local_1978 + local_1a90;
                      if ((*(int *)(*local_18b8 +
                                   ((long)(local_1a8c - (int)local_18b8[4]) +
                                    (long)(local_1978 - *(int *)((long)local_18b8 + 0x24)) *
                                    local_18b8[1] +
                                   (long)(local_1974 - (int)local_18b8[5]) * local_18b8[2]) * 4) ==
                           0) && (*(int *)(*local_18b8 +
                                          ((long)(local_1a8c - (int)local_18b8[4]) +
                                           (long)(local_1978 - *(int *)((long)local_18b8 + 0x24)) *
                                           local_18b8[1] +
                                          (long)(local_1974 - (int)local_18b8[5]) * local_18b8[2]) *
                                          4) == 0)) {
                        local_25c8 = (MFIter *)0x0;
                      }
                      else {
                        std::abs((int)local_18f8[2]);
                        local_25c8 = extraout_XMM0_Qa_09;
                        in_stack_ffffffffffffda40 = extraout_XMM0_Qa_09;
                      }
                      local_1a98 = local_25c8;
                      if ((*(int *)(*local_18b8 +
                                   ((long)(local_197c - (int)local_18b8[4]) +
                                    (long)(local_1a90 - *(int *)((long)local_18b8 + 0x24)) *
                                    local_18b8[1] +
                                   (long)(local_1974 - (int)local_18b8[5]) * local_18b8[2]) * 4) ==
                           0) && (*(int *)(*local_18b8 +
                                          ((long)(local_197c - (int)local_18b8[4]) +
                                           (long)(local_1a90 - *(int *)((long)local_18b8 + 0x24)) *
                                           local_18b8[1] +
                                          (long)(local_1974 - (int)local_18b8[5]) * local_18b8[2]) *
                                          4) == 0)) {
                        local_1aa0 = 0.0;
                      }
                      else {
                        std::abs((int)local_18f8[2]);
                        local_1aa0 = extraout_XMM0_Qa_10;
                      }
                      local_1a78 = (double)local_1a98 * local_1aa0 *
                                   *(double *)
                                    (local_1f80 +
                                    ((long)(local_1a8c - local_1f60) +
                                     (local_1a90 - local_1f5c) * local_1f78 +
                                    ((local_1974 + 1) - local_1f58) * local_1f70) * 8) +
                                   local_1aa0 * (1.0 - (double)local_1a98) *
                                   *(double *)
                                    (local_1f80 +
                                    ((long)(local_197c - local_1f60) +
                                     (local_1a90 - local_1f5c) * local_1f78 +
                                    ((local_1974 + 1) - local_1f58) * local_1f70) * 8) +
                                   (1.0 - (double)local_1a98) * (1.0 - local_1aa0) * local_1a78 +
                                   (double)local_1a98 * (1.0 - local_1aa0) *
                                   *(double *)
                                    (local_1f80 +
                                    ((long)(local_1a8c - local_1f60) +
                                     (local_1978 - local_1f5c) * local_1f78 +
                                    ((local_1974 + 1) - local_1f58) * local_1f70) * 8);
                      local_1a80 = (double)local_1a98 * local_1aa0 *
                                   *(double *)
                                    (local_1f80 +
                                    ((long)(local_1a8c - local_1f60) +
                                     (local_1a90 - local_1f5c) * local_1f78 +
                                     ((local_1974 + 1) - local_1f58) * local_1f70 + local_1f68) * 8)
                                   + local_1aa0 * (1.0 - (double)local_1a98) *
                                     *(double *)
                                      (local_1f80 +
                                      ((long)(local_197c - local_1f60) +
                                       (local_1a90 - local_1f5c) * local_1f78 +
                                       ((local_1974 + 1) - local_1f58) * local_1f70 + local_1f68) *
                                      8) + (1.0 - (double)local_1a98) * (1.0 - local_1aa0) *
                                           local_1a80 +
                                           (double)local_1a98 * (1.0 - local_1aa0) *
                                           *(double *)
                                            (local_1f80 +
                                            ((long)(local_1a8c - local_1f60) +
                                             (local_1978 - local_1f5c) * local_1f78 +
                                             ((local_1974 + 1) - local_1f58) * local_1f70 +
                                            local_1f68) * 8);
                      local_1a88 = (double)local_1a98 * local_1aa0 *
                                   *(double *)
                                    (local_1f80 +
                                    ((long)(local_1a8c - local_1f60) +
                                     (local_1a90 - local_1f5c) * local_1f78 +
                                     ((local_1974 + 1) - local_1f58) * local_1f70 + local_1f68 * 2)
                                    * 8) + local_1aa0 * (1.0 - (double)local_1a98) *
                                           *(double *)
                                            (local_1f80 +
                                            ((long)(local_197c - local_1f60) +
                                             (local_1a90 - local_1f5c) * local_1f78 +
                                             ((local_1974 + 1) - local_1f58) * local_1f70 +
                                            local_1f68 * 2) * 8) +
                                           (1.0 - (double)local_1a98) * (1.0 - local_1aa0) *
                                           local_1a88 +
                                           (double)local_1a98 * (1.0 - local_1aa0) *
                                           *(double *)
                                            (local_1f80 +
                                            ((long)(local_1a8c - local_1f60) +
                                             (local_1978 - local_1f5c) * local_1f78 +
                                             ((local_1974 + 1) - local_1f58) * local_1f70 +
                                            local_1f68 * 2) * 8);
                    }
                    local_1aa8 = *(double *)
                                  (*local_18c8 +
                                  ((long)(local_197c - (int)local_18c8[4]) +
                                   (long)(local_1978 - *(int *)((long)local_18c8 + 0x24)) *
                                   local_18c8[1] +
                                  (long)(local_1974 - (int)local_18c8[5]) * local_18c8[2]) * 8);
                    local_1ab0 = 0.0;
                    local_1ab8 = 0.0;
                    local_1ac0 = 0.0;
                    if ((local_1901 & 1) != 0) {
                      local_1ac8 = *(double *)
                                    (*local_18d0 +
                                    ((long)((local_197c + 1) - (int)local_18d0[4]) +
                                     (long)(local_1978 - *(int *)((long)local_18d0 + 0x24)) *
                                     local_18d0[1] +
                                    (long)(local_1974 - (int)local_18d0[5]) * local_18d0[2]) * 8) -
                                   *(double *)
                                    (*local_18d0 +
                                    ((long)(local_197c - (int)local_18d0[4]) +
                                     (long)(local_1978 - *(int *)((long)local_18d0 + 0x24)) *
                                     local_18d0[1] +
                                    (long)(local_1974 - (int)local_18d0[5]) * local_18d0[2]) * 8);
                      local_1ad0 = *(double *)
                                    (*local_18d8 +
                                    ((long)(local_197c - (int)local_18d8[4]) +
                                     (long)((local_1978 + 1) - *(int *)((long)local_18d8 + 0x24)) *
                                     local_18d8[1] +
                                    (long)(local_1974 - (int)local_18d8[5]) * local_18d8[2]) * 8) -
                                   *(double *)
                                    (*local_18d8 +
                                    ((long)(local_197c - (int)local_18d8[4]) +
                                     (long)(local_1978 - *(int *)((long)local_18d8 + 0x24)) *
                                     local_18d8[1] +
                                    (long)(local_1974 - (int)local_18d8[5]) * local_18d8[2]) * 8);
                      local_1ad8 = *(double *)
                                    (*local_18e0 +
                                    ((long)(local_197c - (int)local_18e0[4]) +
                                     (long)(local_1978 - *(int *)((long)local_18e0 + 0x24)) *
                                     local_18e0[1] +
                                    (long)((local_1974 + 1) - (int)local_18e0[5]) * local_18e0[2]) *
                                    8) - *(double *)
                                          (*local_18e0 +
                                          ((long)(local_197c - (int)local_18e0[4]) +
                                           (long)(local_1978 - *(int *)((long)local_18e0 + 0x24)) *
                                           local_18e0[1] +
                                          (long)(local_1974 - (int)local_18e0[5]) * local_18e0[2]) *
                                          8);
                      local_1ae0 = sqrt(local_1ad8 * local_1ad8 +
                                        local_1ac8 * local_1ac8 + local_1ad0 * local_1ad0);
                      local_1ae0 = 1.0 / local_1ae0;
                      local_1ae8 = -local_1ac8 * local_1ae0;
                      local_1af0 = -local_1ad0 * local_1ae0;
                      local_1af8 = -local_1ad8 * local_1ae0;
                      local_1b00 = 0.0;
                      local_1b08 = 0.0;
                      local_1b10 = 0.0;
                      if ((local_1902 & 1) != 0) {
                        local_1b00 = *(double *)
                                      (*plVar14 +
                                      ((long)(local_197c - (int)plVar14[4]) +
                                       (long)(local_1978 - *(int *)((long)plVar14 + 0x24)) *
                                       plVar14[1] +
                                      (long)(local_1974 - (int)plVar14[5]) * plVar14[2]) * 8);
                        local_1b08 = *(double *)
                                      (*plVar14 +
                                      ((long)(local_197c - (int)plVar14[4]) +
                                       (long)(local_1978 - *(int *)((long)plVar14 + 0x24)) *
                                       plVar14[1] +
                                       (long)(local_1974 - (int)plVar14[5]) * plVar14[2] +
                                      plVar14[3]) * 8);
                        local_1b10 = *(double *)
                                      (*plVar14 +
                                      ((long)(local_197c - (int)plVar14[4]) +
                                       (long)(local_1978 - *(int *)((long)plVar14 + 0x24)) *
                                       plVar14[1] +
                                       (long)(local_1974 - (int)plVar14[5]) * plVar14[2] +
                                      plVar14[3] * 2) * 8);
                      }
                      local_1b20 = 0.3;
                      local_1b28 = (local_1aa8 * local_1aa8 + -0.25) / (local_1aa8 + local_1aa8);
                      pdVar9 = &local_1b20;
                      pdVar8 = std::max<double>(pdVar9,&local_1b28);
                      iVar11 = (int)pdVar9;
                      dVar12 = *pdVar8;
                      local_1b18 = dVar12;
                      std::abs(iVar11);
                      std::abs(iVar11);
                      std::abs(iVar11);
                      pdVar9 = std::max<double>(&local_1b38,&local_1b40);
                      pdVar9 = std::max<double>(pdVar9,&local_1b48);
                      local_1b30 = dVar12 / *pdVar9;
                      local_1b50 = 1.0 / local_1b30;
                      local_1b6c = -1;
                      if (0.0 < local_1ae8) {
                        local_1b6c = 1;
                      }
                      local_1b70 = -1;
                      if (0.0 < local_1af0) {
                        local_1b70 = 1;
                      }
                      local_1b74 = -1;
                      if (0.0 < local_1af8) {
                        local_1b74 = 1;
                      }
                      local_1b78 = local_197c - local_1b6c;
                      local_1b7c = local_1978 - local_1b70;
                      local_1b80 = local_1974 - local_1b74;
                      local_1b58 = (double)local_1b6c *
                                   (-local_1b30 * local_1ae8 +
                                   *(double *)
                                    (*local_1900 +
                                    ((long)(local_197c - (int)local_1900[4]) +
                                     (long)(local_1978 - *(int *)((long)local_1900 + 0x24)) *
                                     local_1900[1] +
                                    (long)(local_1974 - (int)local_1900[5]) * local_1900[2]) * 8));
                      local_1b60 = (double)local_1b70 *
                                   (-local_1b30 * local_1af0 +
                                   *(double *)
                                    (*local_1900 +
                                    ((long)(local_197c - (int)local_1900[4]) +
                                     (long)(local_1978 - *(int *)((long)local_1900 + 0x24)) *
                                     local_1900[1] +
                                     (long)(local_1974 - (int)local_1900[5]) * local_1900[2] +
                                    local_1900[3]) * 8));
                      local_1b68 = (double)local_1b74 *
                                   (-local_1b30 * local_1af8 +
                                   *(double *)
                                    (*local_1900 +
                                    ((long)(local_197c - (int)local_1900[4]) +
                                     (long)(local_1978 - *(int *)((long)local_1900 + 0x24)) *
                                     local_1900[1] +
                                     (long)(local_1974 - (int)local_1900[5]) * local_1900[2] +
                                    local_1900[3] * 2) * 8));
                      local_1b88 = local_1b58 * local_1b60;
                      local_1b90 = local_1b58 * local_1b68;
                      local_1b98 = local_1b60 * local_1b68;
                      local_1ba0 = local_1b58 * local_1b60 * local_1b68;
                      local_1ba8 = local_1b58 + 1.0 + local_1b60 + local_1b68 + local_1b88 +
                                   local_1b90 + local_1b98 + local_1ba0;
                      local_1bb8 = (local_1b00 -
                                   (-local_1ba0 *
                                    *(double *)
                                     (*plVar15 +
                                     ((long)(local_1b78 - (int)plVar15[4]) +
                                      (long)(local_1b7c - *(int *)((long)plVar15 + 0x24)) *
                                      plVar15[1] + (long)(local_1b80 - (int)plVar15[5]) * plVar15[2]
                                     ) * 8) +
                                   (local_1b88 + local_1ba0) *
                                   *(double *)
                                    (*plVar15 +
                                    ((long)(local_1b78 - (int)plVar15[4]) +
                                     (long)(local_1b7c - *(int *)((long)plVar15 + 0x24)) *
                                     plVar15[1] + (long)(local_1974 - (int)plVar15[5]) * plVar15[2])
                                    * 8) + (local_1b90 + local_1ba0) *
                                           *(double *)
                                            (*plVar15 +
                                            ((long)(local_1b78 - (int)plVar15[4]) +
                                             (long)(local_1978 - *(int *)((long)plVar15 + 0x24)) *
                                             plVar15[1] +
                                            (long)(local_1b80 - (int)plVar15[5]) * plVar15[2]) * 8)
                                           + (((-local_1b58 - local_1b88) - local_1b90) - local_1ba0
                                             ) * *(double *)
                                                  (*plVar15 +
                                                  ((long)(local_1b78 - (int)plVar15[4]) +
                                                   (long)(local_1978 -
                                                         *(int *)((long)plVar15 + 0x24)) *
                                                   plVar15[1] +
                                                  (long)(local_1974 - (int)plVar15[5]) * plVar15[2])
                                                  * 8) +
                                             (local_1b98 + local_1ba0) *
                                             *(double *)
                                              (*plVar15 +
                                              ((long)(local_197c - (int)plVar15[4]) +
                                               (long)(local_1b7c - *(int *)((long)plVar15 + 0x24)) *
                                               plVar15[1] +
                                              (long)(local_1b80 - (int)plVar15[5]) * plVar15[2]) * 8
                                              ) + (((-local_1b60 - local_1b88) - local_1b98) -
                                                  local_1ba0) *
                                                  *(double *)
                                                   (*plVar15 +
                                                   ((long)(local_197c - (int)plVar15[4]) +
                                                    (long)(local_1b7c -
                                                          *(int *)((long)plVar15 + 0x24)) *
                                                    plVar15[1] +
                                                   (long)(local_1974 - (int)plVar15[5]) * plVar15[2]
                                                   ) * 8) + local_1ba8 *
                                                            *(double *)
                                                             (*plVar15 +
                                                             ((long)(local_197c - (int)plVar15[4]) +
                                                              (long)(local_1978 -
                                                                    *(int *)((long)plVar15 + 0x24))
                                                              * plVar15[1] +
                                                             (long)(local_1974 - (int)plVar15[5]) *
                                                             plVar15[2]) * 8) +
                                                            (((-local_1b68 - local_1b90) -
                                                             local_1b98) - local_1ba0) *
                                                            *(double *)
                                                             (*plVar15 +
                                                             ((long)(local_197c - (int)plVar15[4]) +
                                                              (long)(local_1978 -
                                                                    *(int *)((long)plVar15 + 0x24))
                                                              * plVar15[1] +
                                                             (long)(local_1b80 - (int)plVar15[5]) *
                                                             plVar15[2]) * 8))) * local_1b50;
                      local_1bc0 = (local_1b08 -
                                   (-local_1ba0 *
                                    *(double *)
                                     (*plVar15 +
                                     ((long)(local_1b78 - (int)plVar15[4]) +
                                      (long)(local_1b7c - *(int *)((long)plVar15 + 0x24)) *
                                      plVar15[1] + (long)(local_1b80 - (int)plVar15[5]) * plVar15[2]
                                     + plVar15[3]) * 8) +
                                   (local_1b88 + local_1ba0) *
                                   *(double *)
                                    (*plVar15 +
                                    ((long)(local_1b78 - (int)plVar15[4]) +
                                     (long)(local_1b7c - *(int *)((long)plVar15 + 0x24)) *
                                     plVar15[1] + (long)(local_1974 - (int)plVar15[5]) * plVar15[2]
                                    + plVar15[3]) * 8) +
                                   (local_1b90 + local_1ba0) *
                                   *(double *)
                                    (*plVar15 +
                                    ((long)(local_1b78 - (int)plVar15[4]) +
                                     (long)(local_1978 - *(int *)((long)plVar15 + 0x24)) *
                                     plVar15[1] + (long)(local_1b80 - (int)plVar15[5]) * plVar15[2]
                                    + plVar15[3]) * 8) +
                                   (((-local_1b58 - local_1b88) - local_1b90) - local_1ba0) *
                                   *(double *)
                                    (*plVar15 +
                                    ((long)(local_1b78 - (int)plVar15[4]) +
                                     (long)(local_1978 - *(int *)((long)plVar15 + 0x24)) *
                                     plVar15[1] + (long)(local_1974 - (int)plVar15[5]) * plVar15[2]
                                    + plVar15[3]) * 8) +
                                   (local_1b98 + local_1ba0) *
                                   *(double *)
                                    (*plVar15 +
                                    ((long)(local_197c - (int)plVar15[4]) +
                                     (long)(local_1b7c - *(int *)((long)plVar15 + 0x24)) *
                                     plVar15[1] + (long)(local_1b80 - (int)plVar15[5]) * plVar15[2]
                                    + plVar15[3]) * 8) +
                                   (((-local_1b60 - local_1b88) - local_1b98) - local_1ba0) *
                                   *(double *)
                                    (*plVar15 +
                                    ((long)(local_197c - (int)plVar15[4]) +
                                     (long)(local_1b7c - *(int *)((long)plVar15 + 0x24)) *
                                     plVar15[1] + (long)(local_1974 - (int)plVar15[5]) * plVar15[2]
                                    + plVar15[3]) * 8) +
                                   local_1ba8 *
                                   *(double *)
                                    (*plVar15 +
                                    ((long)(local_197c - (int)plVar15[4]) +
                                     (long)(local_1978 - *(int *)((long)plVar15 + 0x24)) *
                                     plVar15[1] + (long)(local_1974 - (int)plVar15[5]) * plVar15[2]
                                    + plVar15[3]) * 8) +
                                   (((-local_1b68 - local_1b90) - local_1b98) - local_1ba0) *
                                   *(double *)
                                    (*plVar15 +
                                    ((long)(local_197c - (int)plVar15[4]) +
                                     (long)(local_1978 - *(int *)((long)plVar15 + 0x24)) *
                                     plVar15[1] + (long)(local_1b80 - (int)plVar15[5]) * plVar15[2]
                                    + plVar15[3]) * 8))) * local_1b50;
                      local_1bb0 = -local_1ba0 *
                                   *(double *)
                                    (*plVar15 +
                                    ((long)(local_1b78 - (int)plVar15[4]) +
                                     (long)(local_1b7c - *(int *)((long)plVar15 + 0x24)) *
                                     plVar15[1] + (long)(local_1b80 - (int)plVar15[5]) * plVar15[2]
                                    + plVar15[3] * 2) * 8) +
                                   (local_1b88 + local_1ba0) *
                                   *(double *)
                                    (*plVar15 +
                                    ((long)(local_1b78 - (int)plVar15[4]) +
                                     (long)(local_1b7c - *(int *)((long)plVar15 + 0x24)) *
                                     plVar15[1] + (long)(local_1974 - (int)plVar15[5]) * plVar15[2]
                                    + plVar15[3] * 2) * 8) +
                                   (local_1b90 + local_1ba0) *
                                   *(double *)
                                    (*plVar15 +
                                    ((long)(local_1b78 - (int)plVar15[4]) +
                                     (long)(local_1978 - *(int *)((long)plVar15 + 0x24)) *
                                     plVar15[1] + (long)(local_1b80 - (int)plVar15[5]) * plVar15[2]
                                    + plVar15[3] * 2) * 8) +
                                   (((-local_1b58 - local_1b88) - local_1b90) - local_1ba0) *
                                   *(double *)
                                    (*plVar15 +
                                    ((long)(local_1b78 - (int)plVar15[4]) +
                                     (long)(local_1978 - *(int *)((long)plVar15 + 0x24)) *
                                     plVar15[1] + (long)(local_1974 - (int)plVar15[5]) * plVar15[2]
                                    + plVar15[3] * 2) * 8) +
                                   (local_1b98 + local_1ba0) *
                                   *(double *)
                                    (*plVar15 +
                                    ((long)(local_197c - (int)plVar15[4]) +
                                     (long)(local_1b7c - *(int *)((long)plVar15 + 0x24)) *
                                     plVar15[1] + (long)(local_1b80 - (int)plVar15[5]) * plVar15[2]
                                    + plVar15[3] * 2) * 8) +
                                   (((-local_1b60 - local_1b88) - local_1b98) - local_1ba0) *
                                   *(double *)
                                    (*plVar15 +
                                    ((long)(local_197c - (int)plVar15[4]) +
                                     (long)(local_1b7c - *(int *)((long)plVar15 + 0x24)) *
                                     plVar15[1] + (long)(local_1974 - (int)plVar15[5]) * plVar15[2]
                                    + plVar15[3] * 2) * 8) +
                                   local_1ba8 *
                                   *(double *)
                                    (*plVar15 +
                                    ((long)(local_197c - (int)plVar15[4]) +
                                     (long)(local_1978 - *(int *)((long)plVar15 + 0x24)) *
                                     plVar15[1] + (long)(local_1974 - (int)plVar15[5]) * plVar15[2]
                                    + plVar15[3] * 2) * 8) +
                                   (((-local_1b68 - local_1b90) - local_1b98) - local_1ba0) *
                                   *(double *)
                                    (*plVar15 +
                                    ((long)(local_197c - (int)plVar15[4]) +
                                     (long)(local_1978 - *(int *)((long)plVar15 + 0x24)) *
                                     plVar15[1] + (long)(local_1b80 - (int)plVar15[5]) * plVar15[2]
                                    + plVar15[3] * 2) * 8);
                      local_1bc8 = (local_1b10 - local_1bb0) * local_1b50;
                      local_1bd0 = local_1bb8 * local_1ae8;
                      local_1bd8 = local_1bb8 * local_1af0;
                      local_1be0 = local_1bb8 * local_1af8;
                      local_1be8 = local_1bc0 * local_1ae8;
                      local_1bf0 = local_1bc0 * local_1af0;
                      local_1bf8 = local_1bc0 * local_1af8;
                      local_1c00 = local_1bc8 * local_1ae8;
                      local_1c08 = local_1bc8 * local_1af0;
                      local_1c10 = local_1bc8 * local_1af8;
                      local_1c18 = local_1bd0 + local_1bf0 + local_1c10;
                      local_1c20 = *(double *)
                                    (*local_18b0 +
                                    ((long)(local_197c - (int)local_18b0[4]) +
                                     (long)(local_1978 - *(int *)((long)local_18b0 + 0x24)) *
                                     local_18b0[1] +
                                    (long)(local_1974 - (int)local_18b0[5]) * local_18b0[2]) * 8);
                      local_1c28 = *(double *)
                                    (*plVar13 +
                                    ((long)(local_197c - (int)plVar13[4]) +
                                     (long)(local_1978 - *(int *)((long)plVar13 + 0x24)) *
                                     plVar13[1] + (long)(local_1974 - (int)plVar13[5]) * plVar13[2])
                                    * 8);
                      local_1c30 = (local_1c28 * -0.6666666666666666 + local_1c20) * local_1c18;
                      local_1c38 = local_1c28 * local_1bd0 + local_1c30;
                      local_1c40 = local_1c28 * local_1be8;
                      local_1c48 = local_1c28 * local_1c00;
                      local_1c50 = local_1c28 * local_1bf0 + local_1c30;
                      local_1c58 = local_1c28 * local_1bd8;
                      local_1c60 = local_1c28 * local_1c08;
                      local_1c68 = local_1c28 * local_1c10 + local_1c30;
                      local_1c70 = local_1c28 * local_1be0;
                      local_1c78 = local_1c28 * local_1bf8;
                      local_1ab0 = local_1920 *
                                   (local_1ad8 * local_1c48 +
                                   local_1ac8 * local_1c38 + local_1ad0 * local_1c40);
                      local_1ab8 = local_1920 *
                                   (local_1ad8 * local_1c60 +
                                   local_1ac8 * local_1c58 + local_1ad0 * local_1c50);
                      local_1ac0 = local_1920 *
                                   (local_1ad8 * local_1c68 +
                                   local_1ac8 * local_1c70 + local_1ad0 * local_1c78);
                    }
                    local_1c80 = local_1918 / local_1aa8;
                    lVar10 = (long)(local_197c - local_1ea0) +
                             (local_1978 - local_1e9c) * local_1eb8 +
                             (local_1974 - local_1e98) * local_1eb0;
                    *(double *)(local_1ec0 + lVar10 * 8) =
                         local_1c80 *
                         (local_1920 * local_1ab0 +
                         local_1930 *
                         (*(double *)
                           (*local_18e0 +
                           ((long)(local_197c - (int)local_18e0[4]) +
                            (long)(local_1978 - *(int *)((long)local_18e0 + 0x24)) * local_18e0[1] +
                           (long)((local_1974 + 1) - (int)local_18e0[5]) * local_18e0[2]) * 8) *
                          local_1a78 +
                         -(*(double *)
                            (*local_18e0 +
                            ((long)(local_197c - (int)local_18e0[4]) +
                             (long)(local_1978 - *(int *)((long)local_18e0 + 0x24)) * local_18e0[1]
                            + (long)(local_1974 - (int)local_18e0[5]) * local_18e0[2]) * 8) *
                          local_1a48)) +
                         local_1920 *
                         (*(double *)
                           (*local_18d0 +
                           ((long)((local_197c + 1) - (int)local_18d0[4]) +
                            (long)(local_1978 - *(int *)((long)local_18d0 + 0x24)) * local_18d0[1] +
                           (long)(local_1974 - (int)local_18d0[5]) * local_18d0[2]) * 8) *
                          local_19b8 +
                         -(*(double *)
                            (*local_18d0 +
                            ((long)(local_197c - (int)local_18d0[4]) +
                             (long)(local_1978 - *(int *)((long)local_18d0 + 0x24)) * local_18d0[1]
                            + (long)(local_1974 - (int)local_18d0[5]) * local_18d0[2]) * 8) *
                          local_1988)) +
                         local_1928 *
                         (*(double *)
                           (*local_18d8 +
                           ((long)(local_197c - (int)local_18d8[4]) +
                            (long)((local_1978 + 1) - *(int *)((long)local_18d8 + 0x24)) *
                            local_18d8[1] + (long)(local_1974 - (int)local_18d8[5]) * local_18d8[2])
                           * 8) * local_1a18 +
                         -(*(double *)
                            (*local_18d8 +
                            ((long)(local_197c - (int)local_18d8[4]) +
                             (long)(local_1978 - *(int *)((long)local_18d8 + 0x24)) * local_18d8[1]
                            + (long)(local_1974 - (int)local_18d8[5]) * local_18d8[2]) * 8) *
                          local_19e8))) + *(double *)(local_1ec0 + lVar10 * 8);
                    lVar10 = (long)(local_197c - local_1ea0) +
                             (local_1978 - local_1e9c) * local_1eb8 +
                             (local_1974 - local_1e98) * local_1eb0 + local_1ea8;
                    *(double *)(local_1ec0 + lVar10 * 8) =
                         local_1c80 *
                         (local_1920 * local_1ab8 +
                         local_1930 *
                         (*(double *)
                           (*local_18e0 +
                           ((long)(local_197c - (int)local_18e0[4]) +
                            (long)(local_1978 - *(int *)((long)local_18e0 + 0x24)) * local_18e0[1] +
                           (long)((local_1974 + 1) - (int)local_18e0[5]) * local_18e0[2]) * 8) *
                          local_1a80 +
                         -(*(double *)
                            (*local_18e0 +
                            ((long)(local_197c - (int)local_18e0[4]) +
                             (long)(local_1978 - *(int *)((long)local_18e0 + 0x24)) * local_18e0[1]
                            + (long)(local_1974 - (int)local_18e0[5]) * local_18e0[2]) * 8) *
                          local_1a50)) +
                         local_1920 *
                         (*(double *)
                           (*local_18d0 +
                           ((long)((local_197c + 1) - (int)local_18d0[4]) +
                            (long)(local_1978 - *(int *)((long)local_18d0 + 0x24)) * local_18d0[1] +
                           (long)(local_1974 - (int)local_18d0[5]) * local_18d0[2]) * 8) *
                          local_19c0 +
                         -(*(double *)
                            (*local_18d0 +
                            ((long)(local_197c - (int)local_18d0[4]) +
                             (long)(local_1978 - *(int *)((long)local_18d0 + 0x24)) * local_18d0[1]
                            + (long)(local_1974 - (int)local_18d0[5]) * local_18d0[2]) * 8) *
                          local_1990)) +
                         local_1928 *
                         (*(double *)
                           (*local_18d8 +
                           ((long)(local_197c - (int)local_18d8[4]) +
                            (long)((local_1978 + 1) - *(int *)((long)local_18d8 + 0x24)) *
                            local_18d8[1] + (long)(local_1974 - (int)local_18d8[5]) * local_18d8[2])
                           * 8) * local_1a20 +
                         -(*(double *)
                            (*local_18d8 +
                            ((long)(local_197c - (int)local_18d8[4]) +
                             (long)(local_1978 - *(int *)((long)local_18d8 + 0x24)) * local_18d8[1]
                            + (long)(local_1974 - (int)local_18d8[5]) * local_18d8[2]) * 8) *
                          local_19f0))) + *(double *)(local_1ec0 + lVar10 * 8);
                    lVar10 = (long)(local_197c - local_1ea0) +
                             (local_1978 - local_1e9c) * local_1eb8 +
                             (local_1974 - local_1e98) * local_1eb0 + local_1ea8 * 2;
                    *(double *)(local_1ec0 + lVar10 * 8) =
                         local_1c80 *
                         (local_1920 * local_1ac0 +
                         local_1930 *
                         (*(double *)
                           (*local_18e0 +
                           ((long)(local_197c - (int)local_18e0[4]) +
                            (long)(local_1978 - *(int *)((long)local_18e0 + 0x24)) * local_18e0[1] +
                           (long)((local_1974 + 1) - (int)local_18e0[5]) * local_18e0[2]) * 8) *
                          local_1a88 +
                         -(*(double *)
                            (*local_18e0 +
                            ((long)(local_197c - (int)local_18e0[4]) +
                             (long)(local_1978 - *(int *)((long)local_18e0 + 0x24)) * local_18e0[1]
                            + (long)(local_1974 - (int)local_18e0[5]) * local_18e0[2]) * 8) *
                          local_1a58)) +
                         local_1920 *
                         (*(double *)
                           (*local_18d0 +
                           ((long)((local_197c + 1) - (int)local_18d0[4]) +
                            (long)(local_1978 - *(int *)((long)local_18d0 + 0x24)) * local_18d0[1] +
                           (long)(local_1974 - (int)local_18d0[5]) * local_18d0[2]) * 8) *
                          local_19c8 +
                         -(*(double *)
                            (*local_18d0 +
                            ((long)(local_197c - (int)local_18d0[4]) +
                             (long)(local_1978 - *(int *)((long)local_18d0 + 0x24)) * local_18d0[1]
                            + (long)(local_1974 - (int)local_18d0[5]) * local_18d0[2]) * 8) *
                          local_1998)) +
                         local_1928 *
                         (*(double *)
                           (*local_18d8 +
                           ((long)(local_197c - (int)local_18d8[4]) +
                            (long)((local_1978 + 1) - *(int *)((long)local_18d8 + 0x24)) *
                            local_18d8[1] + (long)(local_1974 - (int)local_18d8[5]) * local_18d8[2])
                           * 8) * local_1a28 +
                         -(*(double *)
                            (*local_18d8 +
                            ((long)(local_197c - (int)local_18d8[4]) +
                             (long)(local_1978 - *(int *)((long)local_18d8 + 0x24)) * local_18d8[1]
                            + (long)(local_1974 - (int)local_18d8[5]) * local_18d8[2]) * 8) *
                          local_19f8))) + *(double *)(local_1ec0 + lVar10 * 8);
                  }
                }
              }
            }
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_2480);
          }
        }
      }
      MFIter::operator++(&local_1e58);
    }
    MFIter::~MFIter((MFIter *)this_01);
  }
  return;
}

Assistant:

void
MLEBTensorOp::apply (int amrlev, int mglev, MultiFab& out, MultiFab& in, BCMode bc_mode,
                     StateMode s_mode, const MLMGBndry* bndry) const
{
    BL_PROFILE("MLEBTensorOp::apply()");
    MLEBABecLap::apply(amrlev, mglev, out, in, bc_mode, s_mode, bndry);

    if (mglev >= m_kappa[amrlev].size()) return;

    applyBCTensor(amrlev, mglev, in, bc_mode, s_mode, bndry);

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
    auto area = (factory) ? factory->getAreaFrac()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};
    auto fcent = (factory) ? factory->getFaceCent()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};
    const MultiCutFab* bcent = (factory) ? &(factory->getBndryCent()) : nullptr;

    const Geometry& geom = m_geom[amrlev][mglev];
    const auto dxinv = geom.InvCellSizeArray();

    Array<MultiFab,AMREX_SPACEDIM>& fluxmf = m_tauflux[amrlev][mglev];
    iMultiFab const& mask = m_cc_mask[amrlev][mglev];
    MultiFab const& etaebmf = *m_eb_b_coeffs[amrlev][mglev];
    MultiFab const& kapebmf = m_eb_kappa[amrlev][mglev];
    Real bscalar = m_b_scalar;

    compCrossTerms(amrlev, mglev, in);

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(out, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();

        auto fabtyp = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;
        if (fabtyp == FabType::covered) continue;

        Array4<Real> const axfab = out.array(mfi);
        AMREX_D_TERM(Array4<Real const> const fxfab = fluxmf[0].const_array(mfi);,
                     Array4<Real const> const fyfab = fluxmf[1].const_array(mfi);,
                     Array4<Real const> const fzfab = fluxmf[2].const_array(mfi););

        if (fabtyp == FabType::regular)
        {
            AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
            {
                mltensor_cross_terms(tbx, axfab, AMREX_D_DECL(fxfab,fyfab,fzfab), dxinv, bscalar);
            });
        }
        else
        {
            Array4<Real const> const& vfab = in.const_array(mfi);
            Array4<Real const> const& etab = etaebmf.const_array(mfi);
            Array4<Real const> const& kapb = kapebmf.const_array(mfi);
            Array4<int const> const& ccm = mask.const_array(mfi);
            Array4<EBCellFlag const> const& flag = flags->const_array(mfi);
            Array4<Real const> const& vol = vfrac->const_array(mfi);
            AMREX_D_TERM(Array4<Real const> const& apx = area[0]->const_array(mfi);,
                         Array4<Real const> const& apy = area[1]->const_array(mfi);,
                         Array4<Real const> const& apz = area[2]->const_array(mfi););
            AMREX_D_TERM(Array4<Real const> const& fcx = fcent[0]->const_array(mfi);,
                         Array4<Real const> const& fcy = fcent[1]->const_array(mfi);,
                         Array4<Real const> const& fcz = fcent[2]->const_array(mfi););
            Array4<Real const> const& bc = bcent->const_array(mfi);

            Array4<Real const> foo;
            const bool is_eb_dirichlet =  isEBDirichlet();
            const bool is_eb_inhomog = m_is_eb_inhomog;
            Array4<Real const> const& velbfab = (is_eb_dirichlet && is_eb_inhomog)
                ? m_eb_phi[amrlev]->const_array(mfi) : foo;

            AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
            {
                mlebtensor_cross_terms(tbx, axfab,
                                       AMREX_D_DECL(fxfab,fyfab,fzfab),
                                       vfab, velbfab, etab, kapb, ccm, flag, vol,
                                       AMREX_D_DECL(apx,apy,apz),
                                       AMREX_D_DECL(fcx,fcy,fcz),
                                       bc, is_eb_dirichlet, is_eb_inhomog,
                                       dxinv, bscalar);
            });
        }
    }
}